

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

void embree::sse2::CurveNiMBIntersector1<4>::
     intersect_t<embree::sse2::SweepCurve1Intersector1<embree::BezierCurveT>,embree::sse2::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  Primitive *pPVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  undefined8 uVar19;
  Primitive PVar20;
  Geometry *pGVar21;
  __int_type_conflict _Var22;
  long lVar23;
  long lVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined6 uVar38;
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  undefined1 auVar43 [12];
  undefined1 auVar44 [12];
  undefined1 auVar45 [12];
  undefined1 auVar46 [12];
  undefined1 auVar47 [12];
  undefined1 auVar48 [12];
  undefined1 auVar49 [12];
  undefined1 auVar50 [12];
  undefined1 auVar51 [12];
  undefined1 auVar52 [12];
  undefined1 auVar53 [12];
  undefined1 auVar54 [12];
  undefined1 auVar55 [12];
  undefined1 auVar56 [12];
  undefined1 auVar57 [12];
  undefined1 auVar58 [12];
  undefined1 auVar59 [12];
  int iVar60;
  undefined4 uVar61;
  ulong uVar62;
  undefined4 uVar65;
  RayHit *extraout_RAX;
  undefined1 (*pauVar63) [16];
  RayHit *extraout_RAX_00;
  RayHit *pRVar64;
  RTCIntersectArguments *pRVar66;
  RTCIntersectArguments *pRVar67;
  int iVar68;
  ulong uVar69;
  ulong uVar70;
  long lVar71;
  long lVar72;
  uint uVar73;
  uint uVar74;
  uint uVar75;
  uint uVar76;
  uint uVar77;
  uint uVar78;
  uint uVar79;
  short sVar80;
  undefined2 uVar122;
  float fVar81;
  float fVar123;
  float fVar124;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar85 [16];
  undefined1 auVar88 [16];
  undefined1 auVar91 [16];
  undefined1 auVar94 [16];
  undefined1 auVar97 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  float pp;
  float fVar125;
  float fVar151;
  float fVar152;
  undefined1 auVar126 [16];
  undefined1 auVar129 [16];
  undefined1 auVar132 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  float fVar153;
  float fVar163;
  float fVar164;
  vfloat4 v;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  float fVar165;
  float fVar184;
  float fVar185;
  vfloat4 v_1;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  float fVar186;
  float fVar195;
  float fVar196;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar192 [16];
  undefined1 auVar194 [16];
  float fVar197;
  float fVar224;
  float fVar225;
  undefined1 auVar198 [16];
  undefined1 auVar201 [16];
  undefined1 auVar204 [16];
  undefined1 auVar207 [16];
  undefined1 auVar210 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar223 [16];
  float fVar226;
  float fVar236;
  float fVar237;
  __m128 a_1;
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar235 [16];
  float fVar238;
  float fVar249;
  float fVar250;
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  float fVar251;
  float fVar252;
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  float fVar253;
  float fVar256;
  float fVar257;
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  float fVar258;
  float fVar270;
  float fVar271;
  undefined1 auVar259 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  float fVar272;
  float fVar278;
  float fVar279;
  undefined1 auVar273 [16];
  undefined1 auVar276 [16];
  float fVar280;
  undefined1 auVar277 [16];
  float fVar281;
  float fVar291;
  float fVar293;
  vfloat4 a;
  float fVar295;
  undefined1 auVar283 [16];
  float fVar282;
  undefined1 auVar284 [16];
  undefined1 auVar287 [16];
  float fVar292;
  float fVar294;
  float fVar296;
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  float fVar297;
  float fVar303;
  float fVar304;
  float fVar305;
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar302 [16];
  float fVar306;
  float fVar307;
  float fVar308;
  float fVar313;
  float fVar314;
  float fVar315;
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  float fVar316;
  float fVar319;
  float fVar320;
  float fVar321;
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  RTCFilterFunctionNArguments args;
  vfloat<4> Oz;
  vfloatx vu0;
  vfloat<4> B;
  vfloat<4> A;
  vfloat<4> rl;
  BBox<embree::vfloat_impl<4>_> tp1;
  vfloat<4> dOz;
  vfloat<4> dOdO;
  BBox<embree::vfloat_impl<4>_> tp0;
  StackEntry stack [4];
  undefined1 local_5c8 [8];
  float fStack_5c0;
  float fStack_5bc;
  float fStack_5a4;
  float fStack_5a0;
  float fStack_59c;
  undefined1 local_588 [8];
  float fStack_580;
  float fStack_57c;
  undefined1 local_568 [8];
  float fStack_560;
  float fStack_55c;
  RTCFilterFunctionNArguments local_558;
  float local_528;
  float fStack_524;
  float fStack_520;
  float fStack_51c;
  undefined1 local_518 [8];
  float fStack_510;
  float fStack_50c;
  undefined4 local_4fc;
  undefined1 local_4f8 [8];
  float fStack_4f0;
  float fStack_4ec;
  undefined1 local_4e8 [8];
  float fStack_4e0;
  float fStack_4dc;
  float local_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float local_4c8;
  float fStack_4c4;
  float fStack_4c0;
  float fStack_4bc;
  float local_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float local_4a8;
  float fStack_4a4;
  float fStack_4a0;
  float fStack_49c;
  undefined8 local_498;
  float fStack_490;
  float fStack_48c;
  undefined4 local_488;
  uint local_484;
  uint local_480;
  uint local_47c;
  uint local_478;
  undefined1 local_468 [8];
  float fStack_460;
  float fStack_45c;
  float local_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float local_448;
  float fStack_444;
  float fStack_440;
  float fStack_43c;
  undefined1 local_438 [8];
  float fStack_430;
  float fStack_42c;
  float local_428;
  float fStack_424;
  float fStack_420;
  float fStack_41c;
  undefined1 local_418 [8];
  float fStack_410;
  float fStack_40c;
  float local_408;
  float fStack_404;
  float fStack_400;
  float fStack_3fc;
  float local_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  undefined1 local_3e8 [8];
  float fStack_3e0;
  float fStack_3dc;
  undefined1 local_3d8 [8];
  float fStack_3d0;
  float fStack_3cc;
  undefined1 local_3c8 [8];
  float fStack_3c0;
  float fStack_3bc;
  undefined1 local_3b8 [8];
  float fStack_3b0;
  float fStack_3ac;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  undefined1 local_378 [16];
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float local_328;
  float fStack_324;
  float fStack_320;
  float fStack_31c;
  undefined1 local_318 [8];
  float fStack_310;
  float fStack_30c;
  undefined1 local_308 [8];
  float fStack_300;
  float fStack_2fc;
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  Primitive *local_2c0;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  undefined1 local_278 [8];
  float fStack_270;
  float fStack_26c;
  undefined1 local_268 [16];
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  undefined1 local_1e8 [16];
  float local_1d8;
  float fStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  undefined1 local_138 [8];
  float fStack_130;
  float fStack_12c;
  undefined1 local_128 [16];
  float local_118 [4];
  undefined1 local_108 [16];
  undefined1 auStack_f8 [16];
  uint auStack_e8 [4];
  undefined8 uStack_d8;
  int aiStack_d0 [40];
  undefined1 auVar84 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 uVar121;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar191 [16];
  undefined1 auVar193 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar222 [16];
  undefined1 auVar234 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  
  PVar20 = prim[1];
  uVar62 = (ulong)(byte)PVar20;
  lVar72 = uVar62 * 0x25;
  pPVar9 = prim + lVar72 + 6;
  fVar164 = *(float *)(pPVar9 + 0xc);
  fVar165 = ((ray->super_RayK<1>).org.field_0.m128[0] - *(float *)pPVar9) * fVar164;
  fVar184 = ((ray->super_RayK<1>).org.field_0.m128[1] - *(float *)(pPVar9 + 4)) * fVar164;
  fVar185 = ((ray->super_RayK<1>).org.field_0.m128[2] - *(float *)(pPVar9 + 8)) * fVar164;
  fVar153 = fVar164 * (ray->super_RayK<1>).dir.field_0.m128[0];
  fVar163 = fVar164 * (ray->super_RayK<1>).dir.field_0.m128[1];
  fVar164 = fVar164 * (ray->super_RayK<1>).dir.field_0.m128[2];
  uVar61 = *(undefined4 *)(prim + uVar62 * 4 + 6);
  uVar121 = (undefined1)((uint)uVar61 >> 0x18);
  uVar122 = CONCAT11(uVar121,uVar121);
  uVar121 = (undefined1)((uint)uVar61 >> 0x10);
  uVar19 = CONCAT35(CONCAT21(uVar122,uVar121),CONCAT14(uVar121,uVar61));
  uVar121 = (undefined1)((uint)uVar61 >> 8);
  uVar38 = CONCAT51(CONCAT41((int)((ulong)uVar19 >> 0x20),uVar121),uVar121);
  sVar80 = CONCAT11((char)uVar61,(char)uVar61);
  uVar69 = CONCAT62(uVar38,sVar80);
  auVar155._8_4_ = 0;
  auVar155._0_8_ = uVar69;
  auVar155._12_2_ = uVar122;
  auVar155._14_2_ = uVar122;
  uVar122 = (undefined2)((ulong)uVar19 >> 0x20);
  auVar263._12_4_ = auVar155._12_4_;
  auVar263._8_2_ = 0;
  auVar263._0_8_ = uVar69;
  auVar263._10_2_ = uVar122;
  auVar82._10_6_ = auVar263._10_6_;
  auVar82._8_2_ = uVar122;
  auVar82._0_8_ = uVar69;
  uVar122 = (undefined2)uVar38;
  auVar39._4_8_ = auVar82._8_8_;
  auVar39._2_2_ = uVar122;
  auVar39._0_2_ = uVar122;
  fVar307 = (float)((int)sVar80 >> 8);
  fVar313 = (float)(auVar39._0_4_ >> 0x18);
  fVar314 = (float)(auVar82._8_4_ >> 0x18);
  uVar61 = *(undefined4 *)(prim + uVar62 * 5 + 6);
  uVar121 = (undefined1)((uint)uVar61 >> 0x18);
  uVar122 = CONCAT11(uVar121,uVar121);
  uVar121 = (undefined1)((uint)uVar61 >> 0x10);
  uVar19 = CONCAT35(CONCAT21(uVar122,uVar121),CONCAT14(uVar121,uVar61));
  uVar121 = (undefined1)((uint)uVar61 >> 8);
  uVar38 = CONCAT51(CONCAT41((int)((ulong)uVar19 >> 0x20),uVar121),uVar121);
  sVar80 = CONCAT11((char)uVar61,(char)uVar61);
  uVar69 = CONCAT62(uVar38,sVar80);
  auVar128._8_4_ = 0;
  auVar128._0_8_ = uVar69;
  auVar128._12_2_ = uVar122;
  auVar128._14_2_ = uVar122;
  uVar122 = (undefined2)((ulong)uVar19 >> 0x20);
  auVar127._12_4_ = auVar128._12_4_;
  auVar127._8_2_ = 0;
  auVar127._0_8_ = uVar69;
  auVar127._10_2_ = uVar122;
  auVar126._10_6_ = auVar127._10_6_;
  auVar126._8_2_ = uVar122;
  auVar126._0_8_ = uVar69;
  uVar122 = (undefined2)uVar38;
  auVar40._4_8_ = auVar126._8_8_;
  auVar40._2_2_ = uVar122;
  auVar40._0_2_ = uVar122;
  fVar186 = (float)((int)sVar80 >> 8);
  fVar195 = (float)(auVar40._0_4_ >> 0x18);
  fVar196 = (float)(auVar126._8_4_ >> 0x18);
  uVar61 = *(undefined4 *)(prim + uVar62 * 6 + 6);
  uVar121 = (undefined1)((uint)uVar61 >> 0x18);
  uVar122 = CONCAT11(uVar121,uVar121);
  uVar121 = (undefined1)((uint)uVar61 >> 0x10);
  uVar19 = CONCAT35(CONCAT21(uVar122,uVar121),CONCAT14(uVar121,uVar61));
  uVar121 = (undefined1)((uint)uVar61 >> 8);
  uVar38 = CONCAT51(CONCAT41((int)((ulong)uVar19 >> 0x20),uVar121),uVar121);
  sVar80 = CONCAT11((char)uVar61,(char)uVar61);
  uVar69 = CONCAT62(uVar38,sVar80);
  auVar131._8_4_ = 0;
  auVar131._0_8_ = uVar69;
  auVar131._12_2_ = uVar122;
  auVar131._14_2_ = uVar122;
  uVar122 = (undefined2)((ulong)uVar19 >> 0x20);
  auVar130._12_4_ = auVar131._12_4_;
  auVar130._8_2_ = 0;
  auVar130._0_8_ = uVar69;
  auVar130._10_2_ = uVar122;
  auVar129._10_6_ = auVar130._10_6_;
  auVar129._8_2_ = uVar122;
  auVar129._0_8_ = uVar69;
  uVar122 = (undefined2)uVar38;
  auVar41._4_8_ = auVar129._8_8_;
  auVar41._2_2_ = uVar122;
  auVar41._0_2_ = uVar122;
  fVar226 = (float)((int)sVar80 >> 8);
  fVar236 = (float)(auVar41._0_4_ >> 0x18);
  fVar237 = (float)(auVar129._8_4_ >> 0x18);
  uVar61 = *(undefined4 *)(prim + uVar62 * 0xf + 6);
  uVar121 = (undefined1)((uint)uVar61 >> 0x18);
  uVar122 = CONCAT11(uVar121,uVar121);
  uVar121 = (undefined1)((uint)uVar61 >> 0x10);
  uVar19 = CONCAT35(CONCAT21(uVar122,uVar121),CONCAT14(uVar121,uVar61));
  uVar121 = (undefined1)((uint)uVar61 >> 8);
  uVar38 = CONCAT51(CONCAT41((int)((ulong)uVar19 >> 0x20),uVar121),uVar121);
  sVar80 = CONCAT11((char)uVar61,(char)uVar61);
  uVar69 = CONCAT62(uVar38,sVar80);
  auVar134._8_4_ = 0;
  auVar134._0_8_ = uVar69;
  auVar134._12_2_ = uVar122;
  auVar134._14_2_ = uVar122;
  uVar122 = (undefined2)((ulong)uVar19 >> 0x20);
  auVar133._12_4_ = auVar134._12_4_;
  auVar133._8_2_ = 0;
  auVar133._0_8_ = uVar69;
  auVar133._10_2_ = uVar122;
  auVar132._10_6_ = auVar133._10_6_;
  auVar132._8_2_ = uVar122;
  auVar132._0_8_ = uVar69;
  uVar122 = (undefined2)uVar38;
  auVar42._4_8_ = auVar132._8_8_;
  auVar42._2_2_ = uVar122;
  auVar42._0_2_ = uVar122;
  fVar81 = (float)((int)sVar80 >> 8);
  fVar123 = (float)(auVar42._0_4_ >> 0x18);
  fVar124 = (float)(auVar132._8_4_ >> 0x18);
  uVar61 = *(undefined4 *)(prim + (ulong)(byte)PVar20 * 0x10 + 6);
  uVar121 = (undefined1)((uint)uVar61 >> 0x18);
  uVar122 = CONCAT11(uVar121,uVar121);
  uVar121 = (undefined1)((uint)uVar61 >> 0x10);
  uVar19 = CONCAT35(CONCAT21(uVar122,uVar121),CONCAT14(uVar121,uVar61));
  uVar121 = (undefined1)((uint)uVar61 >> 8);
  uVar38 = CONCAT51(CONCAT41((int)((ulong)uVar19 >> 0x20),uVar121),uVar121);
  sVar80 = CONCAT11((char)uVar61,(char)uVar61);
  uVar69 = CONCAT62(uVar38,sVar80);
  auVar200._8_4_ = 0;
  auVar200._0_8_ = uVar69;
  auVar200._12_2_ = uVar122;
  auVar200._14_2_ = uVar122;
  uVar122 = (undefined2)((ulong)uVar19 >> 0x20);
  auVar199._12_4_ = auVar200._12_4_;
  auVar199._8_2_ = 0;
  auVar199._0_8_ = uVar69;
  auVar199._10_2_ = uVar122;
  auVar198._10_6_ = auVar199._10_6_;
  auVar198._8_2_ = uVar122;
  auVar198._0_8_ = uVar69;
  uVar122 = (undefined2)uVar38;
  auVar43._4_8_ = auVar198._8_8_;
  auVar43._2_2_ = uVar122;
  auVar43._0_2_ = uVar122;
  fVar238 = (float)((int)sVar80 >> 8);
  fVar249 = (float)(auVar43._0_4_ >> 0x18);
  fVar250 = (float)(auVar198._8_4_ >> 0x18);
  uVar61 = *(undefined4 *)(prim + (ulong)(byte)PVar20 * 0x10 + uVar62 + 6);
  uVar121 = (undefined1)((uint)uVar61 >> 0x18);
  uVar122 = CONCAT11(uVar121,uVar121);
  uVar121 = (undefined1)((uint)uVar61 >> 0x10);
  uVar19 = CONCAT35(CONCAT21(uVar122,uVar121),CONCAT14(uVar121,uVar61));
  uVar121 = (undefined1)((uint)uVar61 >> 8);
  uVar38 = CONCAT51(CONCAT41((int)((ulong)uVar19 >> 0x20),uVar121),uVar121);
  sVar80 = CONCAT11((char)uVar61,(char)uVar61);
  uVar69 = CONCAT62(uVar38,sVar80);
  auVar203._8_4_ = 0;
  auVar203._0_8_ = uVar69;
  auVar203._12_2_ = uVar122;
  auVar203._14_2_ = uVar122;
  uVar122 = (undefined2)((ulong)uVar19 >> 0x20);
  auVar202._12_4_ = auVar203._12_4_;
  auVar202._8_2_ = 0;
  auVar202._0_8_ = uVar69;
  auVar202._10_2_ = uVar122;
  auVar201._10_6_ = auVar202._10_6_;
  auVar201._8_2_ = uVar122;
  auVar201._0_8_ = uVar69;
  uVar122 = (undefined2)uVar38;
  auVar44._4_8_ = auVar201._8_8_;
  auVar44._2_2_ = uVar122;
  auVar44._0_2_ = uVar122;
  fVar258 = (float)((int)sVar80 >> 8);
  fVar270 = (float)(auVar44._0_4_ >> 0x18);
  fVar271 = (float)(auVar201._8_4_ >> 0x18);
  uVar61 = *(undefined4 *)(prim + uVar62 * 0x1a + 6);
  uVar121 = (undefined1)((uint)uVar61 >> 0x18);
  uVar122 = CONCAT11(uVar121,uVar121);
  uVar121 = (undefined1)((uint)uVar61 >> 0x10);
  uVar19 = CONCAT35(CONCAT21(uVar122,uVar121),CONCAT14(uVar121,uVar61));
  uVar121 = (undefined1)((uint)uVar61 >> 8);
  uVar38 = CONCAT51(CONCAT41((int)((ulong)uVar19 >> 0x20),uVar121),uVar121);
  sVar80 = CONCAT11((char)uVar61,(char)uVar61);
  uVar69 = CONCAT62(uVar38,sVar80);
  auVar206._8_4_ = 0;
  auVar206._0_8_ = uVar69;
  auVar206._12_2_ = uVar122;
  auVar206._14_2_ = uVar122;
  uVar122 = (undefined2)((ulong)uVar19 >> 0x20);
  auVar205._12_4_ = auVar206._12_4_;
  auVar205._8_2_ = 0;
  auVar205._0_8_ = uVar69;
  auVar205._10_2_ = uVar122;
  auVar204._10_6_ = auVar205._10_6_;
  auVar204._8_2_ = uVar122;
  auVar204._0_8_ = uVar69;
  uVar122 = (undefined2)uVar38;
  auVar45._4_8_ = auVar204._8_8_;
  auVar45._2_2_ = uVar122;
  auVar45._0_2_ = uVar122;
  fVar253 = (float)((int)sVar80 >> 8);
  fVar256 = (float)(auVar45._0_4_ >> 0x18);
  fVar257 = (float)(auVar204._8_4_ >> 0x18);
  uVar61 = *(undefined4 *)(prim + uVar62 * 0x1b + 6);
  uVar121 = (undefined1)((uint)uVar61 >> 0x18);
  uVar122 = CONCAT11(uVar121,uVar121);
  uVar121 = (undefined1)((uint)uVar61 >> 0x10);
  uVar19 = CONCAT35(CONCAT21(uVar122,uVar121),CONCAT14(uVar121,uVar61));
  uVar121 = (undefined1)((uint)uVar61 >> 8);
  uVar38 = CONCAT51(CONCAT41((int)((ulong)uVar19 >> 0x20),uVar121),uVar121);
  sVar80 = CONCAT11((char)uVar61,(char)uVar61);
  uVar69 = CONCAT62(uVar38,sVar80);
  auVar209._8_4_ = 0;
  auVar209._0_8_ = uVar69;
  auVar209._12_2_ = uVar122;
  auVar209._14_2_ = uVar122;
  uVar122 = (undefined2)((ulong)uVar19 >> 0x20);
  auVar208._12_4_ = auVar209._12_4_;
  auVar208._8_2_ = 0;
  auVar208._0_8_ = uVar69;
  auVar208._10_2_ = uVar122;
  auVar207._10_6_ = auVar208._10_6_;
  auVar207._8_2_ = uVar122;
  auVar207._0_8_ = uVar69;
  uVar122 = (undefined2)uVar38;
  auVar46._4_8_ = auVar207._8_8_;
  auVar46._2_2_ = uVar122;
  auVar46._0_2_ = uVar122;
  fVar272 = (float)((int)sVar80 >> 8);
  fVar278 = (float)(auVar46._0_4_ >> 0x18);
  fVar279 = (float)(auVar207._8_4_ >> 0x18);
  uVar61 = *(undefined4 *)(prim + uVar62 * 0x1c + 6);
  uVar121 = (undefined1)((uint)uVar61 >> 0x18);
  uVar122 = CONCAT11(uVar121,uVar121);
  uVar121 = (undefined1)((uint)uVar61 >> 0x10);
  uVar19 = CONCAT35(CONCAT21(uVar122,uVar121),CONCAT14(uVar121,uVar61));
  uVar121 = (undefined1)((uint)uVar61 >> 8);
  uVar38 = CONCAT51(CONCAT41((int)((ulong)uVar19 >> 0x20),uVar121),uVar121);
  sVar80 = CONCAT11((char)uVar61,(char)uVar61);
  uVar69 = CONCAT62(uVar38,sVar80);
  auVar212._8_4_ = 0;
  auVar212._0_8_ = uVar69;
  auVar212._12_2_ = uVar122;
  auVar212._14_2_ = uVar122;
  uVar122 = (undefined2)((ulong)uVar19 >> 0x20);
  auVar211._12_4_ = auVar212._12_4_;
  auVar211._8_2_ = 0;
  auVar211._0_8_ = uVar69;
  auVar211._10_2_ = uVar122;
  auVar210._10_6_ = auVar211._10_6_;
  auVar210._8_2_ = uVar122;
  auVar210._0_8_ = uVar69;
  uVar122 = (undefined2)uVar38;
  auVar47._4_8_ = auVar210._8_8_;
  auVar47._2_2_ = uVar122;
  auVar47._0_2_ = uVar122;
  fVar125 = (float)((int)sVar80 >> 8);
  fVar151 = (float)(auVar47._0_4_ >> 0x18);
  fVar152 = (float)(auVar210._8_4_ >> 0x18);
  fVar297 = fVar153 * fVar307 + fVar163 * fVar186 + fVar164 * fVar226;
  fVar303 = fVar153 * fVar313 + fVar163 * fVar195 + fVar164 * fVar236;
  fVar304 = fVar153 * fVar314 + fVar163 * fVar196 + fVar164 * fVar237;
  fVar305 = fVar153 * (float)(auVar263._12_4_ >> 0x18) +
            fVar163 * (float)(auVar127._12_4_ >> 0x18) + fVar164 * (float)(auVar130._12_4_ >> 0x18);
  fVar281 = fVar153 * fVar81 + fVar163 * fVar238 + fVar164 * fVar258;
  fVar291 = fVar153 * fVar123 + fVar163 * fVar249 + fVar164 * fVar270;
  fVar293 = fVar153 * fVar124 + fVar163 * fVar250 + fVar164 * fVar271;
  fVar295 = fVar153 * (float)(auVar133._12_4_ >> 0x18) +
            fVar163 * (float)(auVar199._12_4_ >> 0x18) + fVar164 * (float)(auVar202._12_4_ >> 0x18);
  fVar197 = fVar153 * fVar253 + fVar163 * fVar272 + fVar164 * fVar125;
  fVar224 = fVar153 * fVar256 + fVar163 * fVar278 + fVar164 * fVar151;
  fVar225 = fVar153 * fVar257 + fVar163 * fVar279 + fVar164 * fVar152;
  fVar153 = fVar153 * (float)(auVar205._12_4_ >> 0x18) +
            fVar163 * (float)(auVar208._12_4_ >> 0x18) + fVar164 * (float)(auVar211._12_4_ >> 0x18);
  fVar308 = fVar307 * fVar165 + fVar186 * fVar184 + fVar226 * fVar185;
  fVar313 = fVar313 * fVar165 + fVar195 * fVar184 + fVar236 * fVar185;
  fVar314 = fVar314 * fVar165 + fVar196 * fVar184 + fVar237 * fVar185;
  fVar315 = (float)(auVar263._12_4_ >> 0x18) * fVar165 +
            (float)(auVar127._12_4_ >> 0x18) * fVar184 + (float)(auVar130._12_4_ >> 0x18) * fVar185;
  fVar258 = fVar81 * fVar165 + fVar238 * fVar184 + fVar258 * fVar185;
  fVar270 = fVar123 * fVar165 + fVar249 * fVar184 + fVar270 * fVar185;
  fVar271 = fVar124 * fVar165 + fVar250 * fVar184 + fVar271 * fVar185;
  fVar307 = (float)(auVar133._12_4_ >> 0x18) * fVar165 +
            (float)(auVar199._12_4_ >> 0x18) * fVar184 + (float)(auVar202._12_4_ >> 0x18) * fVar185;
  fVar253 = fVar165 * fVar253 + fVar184 * fVar272 + fVar185 * fVar125;
  fVar256 = fVar165 * fVar256 + fVar184 * fVar278 + fVar185 * fVar151;
  fVar257 = fVar165 * fVar257 + fVar184 * fVar279 + fVar185 * fVar152;
  fVar272 = fVar165 * (float)(auVar205._12_4_ >> 0x18) +
            fVar184 * (float)(auVar208._12_4_ >> 0x18) + fVar185 * (float)(auVar211._12_4_ >> 0x18);
  fVar164 = (float)DAT_01f80d30;
  fVar81 = DAT_01f80d30._4_4_;
  fVar123 = DAT_01f80d30._8_4_;
  fVar124 = DAT_01f80d30._12_4_;
  uVar73 = -(uint)(fVar164 <= ABS(fVar297));
  uVar74 = -(uint)(fVar81 <= ABS(fVar303));
  uVar76 = -(uint)(fVar123 <= ABS(fVar304));
  uVar78 = -(uint)(fVar124 <= ABS(fVar305));
  auVar298._0_4_ = (uint)fVar297 & uVar73;
  auVar298._4_4_ = (uint)fVar303 & uVar74;
  auVar298._8_4_ = (uint)fVar304 & uVar76;
  auVar298._12_4_ = (uint)fVar305 & uVar78;
  auVar166._0_4_ = ~uVar73 & (uint)fVar164;
  auVar166._4_4_ = ~uVar74 & (uint)fVar81;
  auVar166._8_4_ = ~uVar76 & (uint)fVar123;
  auVar166._12_4_ = ~uVar78 & (uint)fVar124;
  auVar166 = auVar166 | auVar298;
  uVar73 = -(uint)(fVar164 <= ABS(fVar281));
  uVar74 = -(uint)(fVar81 <= ABS(fVar291));
  uVar76 = -(uint)(fVar123 <= ABS(fVar293));
  uVar78 = -(uint)(fVar124 <= ABS(fVar295));
  auVar283._0_4_ = (uint)fVar281 & uVar73;
  auVar283._4_4_ = (uint)fVar291 & uVar74;
  auVar283._8_4_ = (uint)fVar293 & uVar76;
  auVar283._12_4_ = (uint)fVar295 & uVar78;
  auVar227._0_4_ = ~uVar73 & (uint)fVar164;
  auVar227._4_4_ = ~uVar74 & (uint)fVar81;
  auVar227._8_4_ = ~uVar76 & (uint)fVar123;
  auVar227._12_4_ = ~uVar78 & (uint)fVar124;
  auVar227 = auVar227 | auVar283;
  uVar73 = -(uint)(fVar164 <= ABS(fVar197));
  uVar74 = -(uint)(fVar81 <= ABS(fVar224));
  uVar76 = -(uint)(fVar123 <= ABS(fVar225));
  uVar78 = -(uint)(fVar124 <= ABS(fVar153));
  auVar213._0_4_ = (uint)fVar197 & uVar73;
  auVar213._4_4_ = (uint)fVar224 & uVar74;
  auVar213._8_4_ = (uint)fVar225 & uVar76;
  auVar213._12_4_ = (uint)fVar153 & uVar78;
  auVar239._0_4_ = ~uVar73 & (uint)fVar164;
  auVar239._4_4_ = ~uVar74 & (uint)fVar81;
  auVar239._8_4_ = ~uVar76 & (uint)fVar123;
  auVar239._12_4_ = ~uVar78 & (uint)fVar124;
  auVar239 = auVar239 | auVar213;
  auVar82 = rcpps(_DAT_01f80d30,auVar166);
  fVar164 = auVar82._0_4_;
  fVar124 = auVar82._4_4_;
  fVar186 = auVar82._8_4_;
  fVar238 = auVar82._12_4_;
  fVar164 = (1.0 - auVar166._0_4_ * fVar164) * fVar164 + fVar164;
  fVar124 = (1.0 - auVar166._4_4_ * fVar124) * fVar124 + fVar124;
  fVar186 = (1.0 - auVar166._8_4_ * fVar186) * fVar186 + fVar186;
  fVar238 = (1.0 - auVar166._12_4_ * fVar238) * fVar238 + fVar238;
  auVar82 = rcpps(auVar82,auVar227);
  fVar81 = auVar82._0_4_;
  fVar125 = auVar82._4_4_;
  fVar195 = auVar82._8_4_;
  fVar249 = auVar82._12_4_;
  fVar81 = (1.0 - auVar227._0_4_ * fVar81) * fVar81 + fVar81;
  fVar125 = (1.0 - auVar227._4_4_ * fVar125) * fVar125 + fVar125;
  fVar195 = (1.0 - auVar227._8_4_ * fVar195) * fVar195 + fVar195;
  fVar249 = (1.0 - auVar227._12_4_ * fVar249) * fVar249 + fVar249;
  auVar82 = rcpps(auVar82,auVar239);
  fVar123 = auVar82._0_4_;
  fVar151 = auVar82._4_4_;
  fVar196 = auVar82._8_4_;
  fVar250 = auVar82._12_4_;
  fVar123 = (1.0 - auVar239._0_4_ * fVar123) * fVar123 + fVar123;
  fVar151 = (1.0 - auVar239._4_4_ * fVar151) * fVar151 + fVar151;
  fVar196 = (1.0 - auVar239._8_4_ * fVar196) * fVar196 + fVar196;
  fVar250 = (1.0 - auVar239._12_4_ * fVar250) * fVar250 + fVar250;
  fVar278 = ((ray->super_RayK<1>).dir.field_0.m128[3] - *(float *)(prim + lVar72 + 0x16)) *
            *(float *)(prim + lVar72 + 0x1a);
  uVar69 = *(ulong *)(prim + uVar62 * 7 + 6);
  uVar122 = (undefined2)(uVar69 >> 0x30);
  auVar84._8_4_ = 0;
  auVar84._0_8_ = uVar69;
  auVar84._12_2_ = uVar122;
  auVar84._14_2_ = uVar122;
  uVar122 = (undefined2)(uVar69 >> 0x20);
  auVar289._12_4_ = auVar84._12_4_;
  auVar289._8_2_ = 0;
  auVar289._0_8_ = uVar69;
  auVar289._10_2_ = uVar122;
  auVar83._10_6_ = auVar289._10_6_;
  auVar83._8_2_ = uVar122;
  auVar83._0_8_ = uVar69;
  uVar122 = (undefined2)(uVar69 >> 0x10);
  auVar48._4_8_ = auVar83._8_8_;
  auVar48._2_2_ = uVar122;
  auVar48._0_2_ = uVar122;
  fVar152 = (float)(auVar48._0_4_ >> 0x10);
  fVar197 = (float)(auVar83._8_4_ >> 0x10);
  uVar10 = *(ulong *)(prim + uVar62 * 0xb + 6);
  uVar122 = (undefined2)(uVar10 >> 0x30);
  auVar169._8_4_ = 0;
  auVar169._0_8_ = uVar10;
  auVar169._12_2_ = uVar122;
  auVar169._14_2_ = uVar122;
  uVar122 = (undefined2)(uVar10 >> 0x20);
  auVar168._12_4_ = auVar169._12_4_;
  auVar168._8_2_ = 0;
  auVar168._0_8_ = uVar10;
  auVar168._10_2_ = uVar122;
  auVar167._10_6_ = auVar168._10_6_;
  auVar167._8_2_ = uVar122;
  auVar167._0_8_ = uVar10;
  uVar122 = (undefined2)(uVar10 >> 0x10);
  auVar49._4_8_ = auVar167._8_8_;
  auVar49._2_2_ = uVar122;
  auVar49._0_2_ = uVar122;
  uVar11 = *(ulong *)(prim + uVar62 * 9 + 6);
  uVar122 = (undefined2)(uVar11 >> 0x30);
  auVar87._8_4_ = 0;
  auVar87._0_8_ = uVar11;
  auVar87._12_2_ = uVar122;
  auVar87._14_2_ = uVar122;
  uVar122 = (undefined2)(uVar11 >> 0x20);
  auVar86._12_4_ = auVar87._12_4_;
  auVar86._8_2_ = 0;
  auVar86._0_8_ = uVar11;
  auVar86._10_2_ = uVar122;
  auVar85._10_6_ = auVar86._10_6_;
  auVar85._8_2_ = uVar122;
  auVar85._0_8_ = uVar11;
  uVar122 = (undefined2)(uVar11 >> 0x10);
  auVar50._4_8_ = auVar85._8_8_;
  auVar50._2_2_ = uVar122;
  auVar50._0_2_ = uVar122;
  fVar153 = (float)(auVar50._0_4_ >> 0x10);
  fVar224 = (float)(auVar85._8_4_ >> 0x10);
  uVar12 = *(ulong *)(prim + uVar62 * 0xd + 6);
  uVar122 = (undefined2)(uVar12 >> 0x30);
  auVar242._8_4_ = 0;
  auVar242._0_8_ = uVar12;
  auVar242._12_2_ = uVar122;
  auVar242._14_2_ = uVar122;
  uVar122 = (undefined2)(uVar12 >> 0x20);
  auVar241._12_4_ = auVar242._12_4_;
  auVar241._8_2_ = 0;
  auVar241._0_8_ = uVar12;
  auVar241._10_2_ = uVar122;
  auVar240._10_6_ = auVar241._10_6_;
  auVar240._8_2_ = uVar122;
  auVar240._0_8_ = uVar12;
  uVar122 = (undefined2)(uVar12 >> 0x10);
  auVar51._4_8_ = auVar240._8_8_;
  auVar51._2_2_ = uVar122;
  auVar51._0_2_ = uVar122;
  uVar13 = *(ulong *)(prim + uVar62 * 0x12 + 6);
  uVar122 = (undefined2)(uVar13 >> 0x30);
  auVar90._8_4_ = 0;
  auVar90._0_8_ = uVar13;
  auVar90._12_2_ = uVar122;
  auVar90._14_2_ = uVar122;
  uVar122 = (undefined2)(uVar13 >> 0x20);
  auVar89._12_4_ = auVar90._12_4_;
  auVar89._8_2_ = 0;
  auVar89._0_8_ = uVar13;
  auVar89._10_2_ = uVar122;
  auVar88._10_6_ = auVar89._10_6_;
  auVar88._8_2_ = uVar122;
  auVar88._0_8_ = uVar13;
  uVar122 = (undefined2)(uVar13 >> 0x10);
  auVar52._4_8_ = auVar88._8_8_;
  auVar52._2_2_ = uVar122;
  auVar52._0_2_ = uVar122;
  fVar163 = (float)(auVar52._0_4_ >> 0x10);
  fVar225 = (float)(auVar88._8_4_ >> 0x10);
  uVar70 = (ulong)(uint)((int)(uVar62 * 5) << 2);
  uVar14 = *(ulong *)(prim + uVar62 * 2 + uVar70 + 6);
  uVar122 = (undefined2)(uVar14 >> 0x30);
  auVar261._8_4_ = 0;
  auVar261._0_8_ = uVar14;
  auVar261._12_2_ = uVar122;
  auVar261._14_2_ = uVar122;
  uVar122 = (undefined2)(uVar14 >> 0x20);
  auVar260._12_4_ = auVar261._12_4_;
  auVar260._8_2_ = 0;
  auVar260._0_8_ = uVar14;
  auVar260._10_2_ = uVar122;
  auVar259._10_6_ = auVar260._10_6_;
  auVar259._8_2_ = uVar122;
  auVar259._0_8_ = uVar14;
  uVar122 = (undefined2)(uVar14 >> 0x10);
  auVar53._4_8_ = auVar259._8_8_;
  auVar53._2_2_ = uVar122;
  auVar53._0_2_ = uVar122;
  uVar70 = *(ulong *)(prim + uVar70 + 6);
  uVar122 = (undefined2)(uVar70 >> 0x30);
  auVar93._8_4_ = 0;
  auVar93._0_8_ = uVar70;
  auVar93._12_2_ = uVar122;
  auVar93._14_2_ = uVar122;
  uVar122 = (undefined2)(uVar70 >> 0x20);
  auVar92._12_4_ = auVar93._12_4_;
  auVar92._8_2_ = 0;
  auVar92._0_8_ = uVar70;
  auVar92._10_2_ = uVar122;
  auVar91._10_6_ = auVar92._10_6_;
  auVar91._8_2_ = uVar122;
  auVar91._0_8_ = uVar70;
  uVar122 = (undefined2)(uVar70 >> 0x10);
  auVar54._4_8_ = auVar91._8_8_;
  auVar54._2_2_ = uVar122;
  auVar54._0_2_ = uVar122;
  fVar165 = (float)(auVar54._0_4_ >> 0x10);
  fVar226 = (float)(auVar91._8_4_ >> 0x10);
  uVar15 = *(ulong *)(prim + uVar62 * 0x18 + 6);
  uVar122 = (undefined2)(uVar15 >> 0x30);
  auVar275._8_4_ = 0;
  auVar275._0_8_ = uVar15;
  auVar275._12_2_ = uVar122;
  auVar275._14_2_ = uVar122;
  uVar122 = (undefined2)(uVar15 >> 0x20);
  auVar274._12_4_ = auVar275._12_4_;
  auVar274._8_2_ = 0;
  auVar274._0_8_ = uVar15;
  auVar274._10_2_ = uVar122;
  auVar273._10_6_ = auVar274._10_6_;
  auVar273._8_2_ = uVar122;
  auVar273._0_8_ = uVar15;
  uVar122 = (undefined2)(uVar15 >> 0x10);
  auVar55._4_8_ = auVar273._8_8_;
  auVar55._2_2_ = uVar122;
  auVar55._0_2_ = uVar122;
  uVar16 = *(ulong *)(prim + uVar62 * 0x1d + 6);
  uVar122 = (undefined2)(uVar16 >> 0x30);
  auVar96._8_4_ = 0;
  auVar96._0_8_ = uVar16;
  auVar96._12_2_ = uVar122;
  auVar96._14_2_ = uVar122;
  uVar122 = (undefined2)(uVar16 >> 0x20);
  auVar95._12_4_ = auVar96._12_4_;
  auVar95._8_2_ = 0;
  auVar95._0_8_ = uVar16;
  auVar95._10_2_ = uVar122;
  auVar94._10_6_ = auVar95._10_6_;
  auVar94._8_2_ = uVar122;
  auVar94._0_8_ = uVar16;
  uVar122 = (undefined2)(uVar16 >> 0x10);
  auVar56._4_8_ = auVar94._8_8_;
  auVar56._2_2_ = uVar122;
  auVar56._0_2_ = uVar122;
  fVar184 = (float)(auVar56._0_4_ >> 0x10);
  fVar236 = (float)(auVar94._8_4_ >> 0x10);
  uVar17 = *(ulong *)(prim + uVar62 + (ulong)(byte)PVar20 * 0x20 + 6);
  uVar122 = (undefined2)(uVar17 >> 0x30);
  auVar286._8_4_ = 0;
  auVar286._0_8_ = uVar17;
  auVar286._12_2_ = uVar122;
  auVar286._14_2_ = uVar122;
  uVar122 = (undefined2)(uVar17 >> 0x20);
  auVar285._12_4_ = auVar286._12_4_;
  auVar285._8_2_ = 0;
  auVar285._0_8_ = uVar17;
  auVar285._10_2_ = uVar122;
  auVar284._10_6_ = auVar285._10_6_;
  auVar284._8_2_ = uVar122;
  auVar284._0_8_ = uVar17;
  uVar122 = (undefined2)(uVar17 >> 0x10);
  auVar57._4_8_ = auVar284._8_8_;
  auVar57._2_2_ = uVar122;
  auVar57._0_2_ = uVar122;
  uVar18 = *(ulong *)(prim + ((ulong)(byte)PVar20 * 0x20 - uVar62) + 6);
  uVar122 = (undefined2)(uVar18 >> 0x30);
  auVar99._8_4_ = 0;
  auVar99._0_8_ = uVar18;
  auVar99._12_2_ = uVar122;
  auVar99._14_2_ = uVar122;
  uVar122 = (undefined2)(uVar18 >> 0x20);
  auVar98._12_4_ = auVar99._12_4_;
  auVar98._8_2_ = 0;
  auVar98._0_8_ = uVar18;
  auVar98._10_2_ = uVar122;
  auVar97._10_6_ = auVar98._10_6_;
  auVar97._8_2_ = uVar122;
  auVar97._0_8_ = uVar18;
  uVar122 = (undefined2)(uVar18 >> 0x10);
  auVar58._4_8_ = auVar97._8_8_;
  auVar58._2_2_ = uVar122;
  auVar58._0_2_ = uVar122;
  fVar185 = (float)(auVar58._0_4_ >> 0x10);
  fVar237 = (float)(auVar97._8_4_ >> 0x10);
  uVar62 = *(ulong *)(prim + uVar62 * 0x23 + 6);
  uVar122 = (undefined2)(uVar62 >> 0x30);
  auVar301._8_4_ = 0;
  auVar301._0_8_ = uVar62;
  auVar301._12_2_ = uVar122;
  auVar301._14_2_ = uVar122;
  uVar122 = (undefined2)(uVar62 >> 0x20);
  auVar300._12_4_ = auVar301._12_4_;
  auVar300._8_2_ = 0;
  auVar300._0_8_ = uVar62;
  auVar300._10_2_ = uVar122;
  auVar299._10_6_ = auVar300._10_6_;
  auVar299._8_2_ = uVar122;
  auVar299._0_8_ = uVar62;
  uVar122 = (undefined2)(uVar62 >> 0x10);
  auVar59._4_8_ = auVar299._8_8_;
  auVar59._2_2_ = uVar122;
  auVar59._0_2_ = uVar122;
  auVar170._0_8_ =
       CONCAT44(((((float)(auVar49._0_4_ >> 0x10) - fVar152) * fVar278 + fVar152) - fVar313) *
                fVar124,((((float)(int)(short)uVar10 - (float)(int)(short)uVar69) * fVar278 +
                         (float)(int)(short)uVar69) - fVar308) * fVar164);
  auVar170._8_4_ =
       ((((float)(auVar167._8_4_ >> 0x10) - fVar197) * fVar278 + fVar197) - fVar314) * fVar186;
  auVar170._12_4_ =
       ((((float)(auVar168._12_4_ >> 0x10) - (float)(auVar289._12_4_ >> 0x10)) * fVar278 +
        (float)(auVar289._12_4_ >> 0x10)) - fVar315) * fVar238;
  auVar243._0_4_ =
       ((((float)(int)(short)uVar12 - (float)(int)(short)uVar11) * fVar278 +
        (float)(int)(short)uVar11) - fVar308) * fVar164;
  auVar243._4_4_ =
       ((((float)(auVar51._0_4_ >> 0x10) - fVar153) * fVar278 + fVar153) - fVar313) * fVar124;
  auVar243._8_4_ =
       ((((float)(auVar240._8_4_ >> 0x10) - fVar224) * fVar278 + fVar224) - fVar314) * fVar186;
  auVar243._12_4_ =
       ((((float)(auVar241._12_4_ >> 0x10) - (float)(auVar86._12_4_ >> 0x10)) * fVar278 +
        (float)(auVar86._12_4_ >> 0x10)) - fVar315) * fVar238;
  auVar262._0_8_ =
       CONCAT44(((((float)(auVar53._0_4_ >> 0x10) - fVar163) * fVar278 + fVar163) - fVar270) *
                fVar125,((((float)(int)(short)uVar14 - (float)(int)(short)uVar13) * fVar278 +
                         (float)(int)(short)uVar13) - fVar258) * fVar81);
  auVar262._8_4_ =
       ((((float)(auVar259._8_4_ >> 0x10) - fVar225) * fVar278 + fVar225) - fVar271) * fVar195;
  auVar262._12_4_ =
       ((((float)(auVar260._12_4_ >> 0x10) - (float)(auVar89._12_4_ >> 0x10)) * fVar278 +
        (float)(auVar89._12_4_ >> 0x10)) - fVar307) * fVar249;
  auVar276._0_4_ =
       ((((float)(int)(short)uVar15 - (float)(int)(short)uVar70) * fVar278 +
        (float)(int)(short)uVar70) - fVar258) * fVar81;
  auVar276._4_4_ =
       ((((float)(auVar55._0_4_ >> 0x10) - fVar165) * fVar278 + fVar165) - fVar270) * fVar125;
  auVar276._8_4_ =
       ((((float)(auVar273._8_4_ >> 0x10) - fVar226) * fVar278 + fVar226) - fVar271) * fVar195;
  auVar276._12_4_ =
       ((((float)(auVar274._12_4_ >> 0x10) - (float)(auVar92._12_4_ >> 0x10)) * fVar278 +
        (float)(auVar92._12_4_ >> 0x10)) - fVar307) * fVar249;
  auVar287._0_8_ =
       CONCAT44(((((float)(auVar57._0_4_ >> 0x10) - fVar184) * fVar278 + fVar184) - fVar256) *
                fVar151,((((float)(int)(short)uVar17 - (float)(int)(short)uVar16) * fVar278 +
                         (float)(int)(short)uVar16) - fVar253) * fVar123);
  auVar287._8_4_ =
       ((((float)(auVar284._8_4_ >> 0x10) - fVar236) * fVar278 + fVar236) - fVar257) * fVar196;
  auVar287._12_4_ =
       ((((float)(auVar285._12_4_ >> 0x10) - (float)(auVar95._12_4_ >> 0x10)) * fVar278 +
        (float)(auVar95._12_4_ >> 0x10)) - fVar272) * fVar250;
  auVar302._0_4_ =
       ((((float)(int)(short)uVar62 - (float)(int)(short)uVar18) * fVar278 +
        (float)(int)(short)uVar18) - fVar253) * fVar123;
  auVar302._4_4_ =
       ((((float)(auVar59._0_4_ >> 0x10) - fVar185) * fVar278 + fVar185) - fVar256) * fVar151;
  auVar302._8_4_ =
       ((((float)(auVar299._8_4_ >> 0x10) - fVar237) * fVar278 + fVar237) - fVar257) * fVar196;
  auVar302._12_4_ =
       ((((float)(auVar300._12_4_ >> 0x10) - (float)(auVar98._12_4_ >> 0x10)) * fVar278 +
        (float)(auVar98._12_4_ >> 0x10)) - fVar272) * fVar250;
  auVar154._8_4_ = auVar170._8_4_;
  auVar154._0_8_ = auVar170._0_8_;
  auVar154._12_4_ = auVar170._12_4_;
  auVar155 = minps(auVar154,auVar243);
  auVar100._8_4_ = auVar262._8_4_;
  auVar100._0_8_ = auVar262._0_8_;
  auVar100._12_4_ = auVar262._12_4_;
  auVar82 = minps(auVar100,auVar276);
  auVar155 = maxps(auVar155,auVar82);
  auVar101._8_4_ = auVar287._8_4_;
  auVar101._0_8_ = auVar287._0_8_;
  auVar101._12_4_ = auVar287._12_4_;
  auVar82 = minps(auVar101,auVar302);
  uVar61 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar135._4_4_ = uVar61;
  auVar135._0_4_ = uVar61;
  auVar135._8_4_ = uVar61;
  auVar135._12_4_ = uVar61;
  auVar82 = maxps(auVar82,auVar135);
  auVar82 = maxps(auVar155,auVar82);
  auVar155 = maxps(auVar170,auVar243);
  auVar263 = maxps(auVar262,auVar276);
  auVar155 = minps(auVar155,auVar263);
  local_258 = auVar82._0_4_ * 0.99999964;
  fStack_254 = auVar82._4_4_ * 0.99999964;
  fStack_250 = auVar82._8_4_ * 0.99999964;
  fStack_24c = auVar82._12_4_ * 0.99999964;
  auVar82 = maxps(auVar287,auVar302);
  fVar164 = (ray->super_RayK<1>).tfar;
  auVar102._4_4_ = fVar164;
  auVar102._0_4_ = fVar164;
  auVar102._8_4_ = fVar164;
  auVar102._12_4_ = fVar164;
  auVar82 = minps(auVar82,auVar102);
  auVar82 = minps(auVar155,auVar82);
  uVar73 = (uint)(byte)PVar20;
  auVar136._0_4_ = -(uint)(uVar73 != 0 && local_258 <= auVar82._0_4_ * 1.0000004);
  auVar136._4_4_ = -(uint)(1 < uVar73 && fStack_254 <= auVar82._4_4_ * 1.0000004);
  auVar136._8_4_ = -(uint)(2 < uVar73 && fStack_250 <= auVar82._8_4_ * 1.0000004);
  auVar136._12_4_ = -(uint)(3 < uVar73 && fStack_24c <= auVar82._12_4_ * 1.0000004);
  uVar73 = movmskps(uVar73,auVar136);
  if (uVar73 == 0) {
    return;
  }
  uVar73 = uVar73 & 0xff;
  local_1e8._0_12_ = mm_lookupmask_ps._240_12_;
  local_1e8._12_4_ = 0;
  local_2c0 = prim;
LAB_00ad7710:
  lVar72 = 0;
  if (uVar73 != 0) {
    for (; (uVar73 >> lVar72 & 1) == 0; lVar72 = lVar72 + 1) {
    }
  }
  uVar74 = *(uint *)(local_2c0 + 2);
  pRVar67 = (RTCIntersectArguments *)(ulong)uVar74;
  uVar76 = *(uint *)(local_2c0 + lVar72 * 4 + 6);
  pGVar21 = (context->scene->geometries).items[(long)pRVar67].ptr;
  uVar69 = (ulong)*(uint *)(*(long *)&pGVar21->field_0x58 +
                           (ulong)uVar76 *
                           pGVar21[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  local_4a8 = pGVar21->fnumTimeSegments;
  fVar164 = (pGVar21->time_range).lower;
  fVar81 = (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar164) /
           ((pGVar21->time_range).upper - fVar164)) * local_4a8;
  fVar164 = floorf(fVar81);
  if (local_4a8 + -1.0 <= fVar164) {
    fVar164 = local_4a8 + -1.0;
  }
  fVar123 = 0.0;
  if (0.0 <= fVar164) {
    fVar123 = fVar164;
  }
  fVar81 = fVar81 - fVar123;
  fVar163 = 1.0 - fVar81;
  _Var22 = pGVar21[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar71 = (long)(int)fVar123 * 0x38;
  lVar72 = *(long *)(_Var22 + lVar71);
  lVar23 = *(long *)(_Var22 + 0x10 + lVar71);
  pRVar66 = (RTCIntersectArguments *)(lVar23 * (uVar69 + 3));
  lVar24 = *(long *)(_Var22 + 0x38 + lVar71);
  lVar71 = *(long *)(_Var22 + 0x48 + lVar71);
  pfVar1 = (float *)(lVar24 + uVar69 * lVar71);
  pfVar2 = (float *)(lVar72 + lVar23 * uVar69);
  fVar195 = *pfVar2 * fVar163 + *pfVar1 * fVar81;
  fVar196 = pfVar2[1] * fVar163 + pfVar1[1] * fVar81;
  fVar197 = pfVar2[2] * fVar163 + pfVar1[2] * fVar81;
  pfVar3 = (float *)(lVar24 + (uVar69 + 1) * lVar71);
  pfVar4 = (float *)(lVar72 + lVar23 * (uVar69 + 1));
  fVar165 = *pfVar4 * fVar163 + *pfVar3 * fVar81;
  fVar152 = pfVar4[1] * fVar163 + pfVar3[1] * fVar81;
  fVar151 = pfVar4[2] * fVar163 + pfVar3[2] * fVar81;
  pfVar5 = (float *)(lVar24 + (uVar69 + 2) * lVar71);
  pfVar6 = (float *)(lVar72 + lVar23 * (uVar69 + 2));
  local_178 = *pfVar6 * fVar163 + *pfVar5 * fVar81;
  fStack_334 = pfVar6[1] * fVar163 + pfVar5[1] * fVar81;
  local_188 = pfVar6[2] * fVar163 + pfVar5[2] * fVar81;
  pfVar7 = (float *)(lVar24 + lVar71 * (uVar69 + 3));
  pfVar8 = (float *)((long)&pRVar66->flags + lVar72);
  local_568._0_4_ = fVar163 * *pfVar8 + fVar81 * *pfVar7;
  local_568._4_4_ = fVar163 * pfVar8[1] + fVar81 * pfVar7[1];
  fStack_560 = fVar163 * pfVar8[2] + fVar81 * pfVar7[2];
  fVar164 = (ray->super_RayK<1>).org.field_0.m128[0];
  fVar123 = (ray->super_RayK<1>).org.field_0.m128[1];
  fVar124 = (ray->super_RayK<1>).org.field_0.m128[2];
  local_2f8 = (ray->super_RayK<1>).dir.field_0.m128[0];
  local_458 = (ray->super_RayK<1>).dir.field_0.m128[1];
  local_528 = (ray->super_RayK<1>).dir.field_0.m128[2];
  fVar125 = (ray->super_RayK<1>).dir.field_0.m128[3];
  fStack_13c = local_2f8 * local_2f8;
  fVar184 = local_458 * local_458;
  fVar185 = local_528 * local_528;
  fVar125 = fVar125 * fVar125;
  fVar153 = fStack_13c + fVar184 + fVar185;
  auVar187._0_8_ = CONCAT44(fVar184 + fVar184 + fVar125,fVar153);
  auVar187._8_4_ = fVar185 + fVar184 + fVar185;
  auVar187._12_4_ = fVar125 + fVar184 + fVar125;
  auVar171._8_4_ = auVar187._8_4_;
  auVar171._0_8_ = auVar187._0_8_;
  auVar171._12_4_ = auVar187._12_4_;
  auVar82 = rcpss(auVar171,auVar187);
  local_4d8 = (2.0 - fVar153 * auVar82._0_4_) * auVar82._0_4_ *
              (((fVar197 + fVar151 + local_188 + fStack_560) * 0.25 - fVar124) * local_528 +
              ((fVar196 + fVar152 + fStack_334 + (float)local_568._4_4_) * 0.25 - fVar123) *
              local_458 +
              ((fVar195 + fVar165 + local_178 + (float)local_568._0_4_) * 0.25 - fVar164) *
              local_2f8);
  local_2e8 = ZEXT416((uint)local_4d8);
  fVar164 = local_2f8 * local_4d8 + fVar164;
  fVar123 = local_458 * local_4d8 + fVar123;
  fVar124 = local_528 * local_4d8 + fVar124;
  fVar195 = fVar195 - fVar164;
  fVar196 = fVar196 - fVar123;
  fVar197 = fVar197 - fVar124;
  fVar224 = (pfVar2[3] * fVar163 + pfVar1[3] * fVar81) - 0.0;
  local_178 = local_178 - fVar164;
  fStack_334 = fStack_334 - fVar123;
  local_188 = local_188 - fVar124;
  fStack_32c = (pfVar6[3] * fVar163 + pfVar5[3] * fVar81) - 0.0;
  fVar165 = fVar165 - fVar164;
  fVar152 = fVar152 - fVar123;
  fVar151 = fVar151 - fVar124;
  fVar225 = (pfVar4[3] * fVar163 + pfVar3[3] * fVar81) - 0.0;
  local_568._0_4_ = (float)local_568._0_4_ - fVar164;
  local_568._4_4_ = (float)local_568._4_4_ - fVar123;
  fStack_560 = fStack_560 - fVar124;
  fStack_55c = (fVar163 * pfVar8[3] + fVar81 * pfVar7[3]) - 0.0;
  local_158 = fVar197;
  fStack_154 = fVar197;
  fStack_150 = fVar197;
  fStack_14c = fVar197;
  local_168 = fVar224;
  fStack_164 = fVar224;
  fStack_160 = fVar224;
  fStack_15c = fVar224;
  local_148 = fStack_13c + fVar185 + fVar184;
  fStack_144 = fStack_13c + fVar185 + fVar184;
  fStack_140 = fStack_13c + fVar185 + fVar184;
  fStack_13c = fStack_13c + fVar185 + fVar184;
  fStack_174 = local_178;
  fStack_170 = local_178;
  fStack_16c = local_178;
  fStack_184 = local_188;
  fStack_180 = local_188;
  fStack_17c = local_188;
  local_338 = local_178;
  fStack_330 = local_188;
  local_288 = fStack_32c;
  fStack_284 = fStack_32c;
  fStack_280 = fStack_32c;
  fStack_27c = fStack_32c;
  local_198 = (float)local_568._0_4_;
  fStack_194 = (float)local_568._0_4_;
  fStack_190 = (float)local_568._0_4_;
  fStack_18c = (float)local_568._0_4_;
  local_1a8 = (float)local_568._4_4_;
  fStack_1a4 = (float)local_568._4_4_;
  fStack_1a0 = (float)local_568._4_4_;
  fStack_19c = (float)local_568._4_4_;
  local_1b8 = fStack_560;
  fStack_1b4 = fStack_560;
  fStack_1b0 = fStack_560;
  fStack_1ac = fStack_560;
  local_1c8 = fStack_55c;
  fStack_1c4 = fStack_55c;
  fStack_1c0 = fStack_55c;
  fStack_1bc = fStack_55c;
  fStack_2f4 = local_2f8;
  fStack_2f0 = local_2f8;
  fStack_2ec = local_2f8;
  fStack_454 = local_458;
  fStack_450 = local_458;
  fStack_44c = local_458;
  local_298 = ABS(local_148);
  fStack_294 = ABS(fStack_144);
  fStack_290 = ABS(fStack_140);
  fStack_28c = ABS(fStack_13c);
  fVar164 = 1.4013e-45;
  uVar69 = 0;
  local_1d8 = 0.0;
  fStack_1d4 = 1.0;
  local_208 = fVar195;
  fStack_204 = fVar195;
  fStack_200 = fVar195;
  fStack_1fc = fVar195;
  local_218 = fVar196;
  fStack_214 = fVar196;
  fStack_210 = fVar196;
  fStack_20c = fVar196;
  local_348 = fVar165;
  fStack_344 = fVar165;
  fStack_340 = fVar165;
  fStack_33c = fVar165;
  local_358 = fVar152;
  fStack_354 = fVar152;
  fStack_350 = fVar152;
  fStack_34c = fVar152;
  local_368 = fVar151;
  fStack_364 = fVar151;
  fStack_360 = fVar151;
  fStack_35c = fVar151;
  local_228 = fStack_334;
  fStack_224 = fStack_334;
  fStack_220 = fStack_334;
  fStack_21c = fStack_334;
  fVar125 = fVar152;
  fVar153 = fVar152;
  fVar163 = fVar152;
  fVar81 = fVar151;
  fVar123 = fVar151;
  fVar124 = fVar151;
  fVar184 = fVar165;
  fVar185 = fVar165;
  fVar186 = fVar165;
  fStack_524 = local_528;
  fStack_520 = local_528;
  fStack_51c = local_528;
  fStack_4d4 = local_4d8;
  fStack_4d0 = local_4d8;
  fStack_4cc = local_4d8;
  local_4a8 = fVar165;
  fStack_4a4 = fVar152;
  fStack_4a0 = fVar151;
  fStack_49c = fVar225;
  do {
    uVar61 = SUB84(pRVar66,0);
    iVar68 = (int)uVar69;
    local_418._4_4_ = fStack_1d4 - local_1d8;
    uStack_1d0 = 0;
    uStack_1cc = 0;
    local_418._0_4_ = local_418._4_4_;
    fStack_410 = (float)local_418._4_4_;
    fStack_40c = (float)local_418._4_4_;
    local_428 = local_1d8;
    fStack_424 = local_1d8;
    fStack_420 = local_1d8;
    fStack_41c = local_1d8;
    fVar226 = (float)local_418._4_4_ * 0.0 + local_1d8;
    fVar236 = (float)local_418._4_4_ * 0.33333334 + local_1d8;
    fVar237 = (float)local_418._4_4_ * 0.6666667 + local_1d8;
    fVar238 = (float)local_418._4_4_ * 1.0 + local_1d8;
    fVar282 = 1.0 - fVar226;
    fVar292 = 1.0 - fVar236;
    fVar294 = 1.0 - fVar237;
    fVar296 = 1.0 - fVar238;
    fVar313 = fVar165 * fVar282 + local_178 * fVar226;
    fVar314 = fVar184 * fVar292 + fStack_174 * fVar236;
    fVar315 = fVar185 * fVar294 + fStack_170 * fVar237;
    fVar280 = fVar186 * fVar296 + fStack_16c * fVar238;
    fVar249 = fVar152 * fVar282 + local_228 * fVar226;
    fVar250 = fVar125 * fVar292 + fStack_224 * fVar236;
    fVar258 = fVar153 * fVar294 + fStack_220 * fVar237;
    fVar270 = fVar163 * fVar296 + fStack_21c * fVar238;
    fVar303 = fVar151 * fVar282 + local_188 * fVar226;
    fVar304 = fVar81 * fVar292 + fStack_184 * fVar236;
    fVar305 = fVar123 * fVar294 + fStack_180 * fVar237;
    fVar308 = fVar124 * fVar296 + fStack_17c * fVar238;
    fVar291 = fVar225 * fVar282 + local_288 * fVar226;
    fVar293 = fVar225 * fVar292 + fStack_284 * fVar236;
    fVar295 = fVar225 * fVar294 + fStack_280 * fVar237;
    fVar297 = fVar225 * fVar296 + fStack_27c * fVar238;
    fVar165 = (local_208 * fVar282 + fVar165 * fVar226) * fVar282 + fVar226 * fVar313;
    fVar184 = (fStack_204 * fVar292 + fVar184 * fVar236) * fVar292 + fVar236 * fVar314;
    fVar185 = (fStack_200 * fVar294 + fVar185 * fVar237) * fVar294 + fVar237 * fVar315;
    fVar186 = (fStack_1fc * fVar296 + fVar186 * fVar238) * fVar296 + fVar238 * fVar280;
    fVar152 = (local_218 * fVar282 + fVar152 * fVar226) * fVar282 + fVar226 * fVar249;
    fVar271 = (fStack_214 * fVar292 + fVar125 * fVar236) * fVar292 + fVar236 * fVar250;
    fVar153 = (fStack_210 * fVar294 + fVar153 * fVar237) * fVar294 + fVar237 * fVar258;
    fVar163 = (fStack_20c * fVar296 + fVar163 * fVar238) * fVar296 + fVar238 * fVar270;
    fVar307 = (local_158 * fVar282 + fVar151 * fVar226) * fVar282 + fVar226 * fVar303;
    fVar253 = (fStack_154 * fVar292 + fVar81 * fVar236) * fVar292 + fVar236 * fVar304;
    fVar256 = (fStack_150 * fVar294 + fVar123 * fVar237) * fVar294 + fVar237 * fVar305;
    fVar257 = (fStack_14c * fVar296 + fVar124 * fVar238) * fVar296 + fVar238 * fVar308;
    fVar272 = (local_168 * fVar282 + fVar225 * fVar226) * fVar282 + fVar226 * fVar291;
    fVar278 = (fStack_164 * fVar292 + fVar225 * fVar236) * fVar292 + fVar236 * fVar293;
    fVar279 = (fStack_160 * fVar294 + fVar225 * fVar237) * fVar294 + fVar237 * fVar295;
    fVar281 = (fStack_15c * fVar296 + fVar225 * fVar238) * fVar296 + fVar238 * fVar297;
    fVar313 = fVar313 * fVar282 + (local_178 * fVar282 + local_198 * fVar226) * fVar226;
    fVar314 = fVar314 * fVar292 + (fStack_174 * fVar292 + fStack_194 * fVar236) * fVar236;
    fVar315 = fVar315 * fVar294 + (fStack_170 * fVar294 + fStack_190 * fVar237) * fVar237;
    fVar280 = fVar280 * fVar296 + (fStack_16c * fVar296 + fStack_18c * fVar238) * fVar238;
    fVar123 = fVar249 * fVar282 + (local_228 * fVar282 + local_1a8 * fVar226) * fVar226;
    fVar124 = fVar250 * fVar292 + (fStack_224 * fVar292 + fStack_1a4 * fVar236) * fVar236;
    fVar125 = fVar258 * fVar294 + (fStack_220 * fVar294 + fStack_1a0 * fVar237) * fVar237;
    fVar151 = fVar270 * fVar296 + (fStack_21c * fVar296 + fStack_19c * fVar238) * fVar238;
    fVar303 = fVar303 * fVar282 + (local_188 * fVar282 + local_1b8 * fVar226) * fVar226;
    fVar304 = fVar304 * fVar292 + (fStack_184 * fVar292 + fStack_1b4 * fVar236) * fVar236;
    fVar305 = fVar305 * fVar294 + (fStack_180 * fVar294 + fStack_1b0 * fVar237) * fVar237;
    fVar308 = fVar308 * fVar296 + (fStack_17c * fVar296 + fStack_1ac * fVar238) * fVar238;
    fVar249 = fVar291 * fVar282 + (local_288 * fVar282 + local_1c8 * fVar226) * fVar226;
    fVar250 = fVar293 * fVar292 + (fStack_284 * fVar292 + fStack_1c4 * fVar236) * fVar236;
    fVar258 = fVar295 * fVar294 + (fStack_280 * fVar294 + fStack_1c0 * fVar237) * fVar237;
    fVar270 = fVar297 * fVar296 + (fStack_27c * fVar296 + fStack_1bc * fVar238) * fVar238;
    local_4b8 = fVar282 * fVar165 + fVar226 * fVar313;
    fStack_4b4 = fVar292 * fVar184 + fVar236 * fVar314;
    fStack_4b0 = fVar294 * fVar185 + fVar237 * fVar315;
    fStack_4ac = fVar296 * fVar186 + fVar238 * fVar280;
    fVar316 = fVar282 * fVar152 + fVar226 * fVar123;
    fVar319 = fVar292 * fVar271 + fVar236 * fVar124;
    fVar320 = fVar294 * fVar153 + fVar237 * fVar125;
    fVar321 = fVar296 * fVar163 + fVar238 * fVar151;
    fVar291 = fVar282 * fVar307 + fVar226 * fVar303;
    fVar293 = fVar292 * fVar253 + fVar236 * fVar304;
    fVar297 = fVar294 * fVar256 + fVar237 * fVar305;
    fVar306 = fVar296 * fVar257 + fVar238 * fVar308;
    fVar81 = (float)local_418._4_4_ * 0.11111111;
    fVar226 = fVar282 * fVar272 + fVar226 * fVar249;
    fVar236 = fVar292 * fVar278 + fVar236 * fVar250;
    auVar288._0_8_ = CONCAT44(fVar236,fVar226);
    auVar288._8_4_ = fVar294 * fVar279 + fVar237 * fVar258;
    auVar288._12_4_ = fVar296 * fVar281 + fVar238 * fVar270;
    local_388 = (fVar313 - fVar165) * 3.0 * fVar81;
    fStack_384 = (fVar314 - fVar184) * 3.0 * fVar81;
    fStack_380 = (fVar315 - fVar185) * 3.0 * fVar81;
    fStack_37c = (fVar280 - fVar186) * 3.0 * fVar81;
    local_398 = (fVar123 - fVar152) * 3.0 * fVar81;
    fStack_394 = (fVar124 - fVar271) * 3.0 * fVar81;
    fStack_390 = (fVar125 - fVar153) * 3.0 * fVar81;
    fStack_38c = (fVar151 - fVar163) * 3.0 * fVar81;
    local_3a8 = (fVar303 - fVar307) * 3.0 * fVar81;
    fStack_3a4 = (fVar304 - fVar253) * 3.0 * fVar81;
    fStack_3a0 = (fVar305 - fVar256) * 3.0 * fVar81;
    fStack_39c = (fVar308 - fVar257) * 3.0 * fVar81;
    fVar123 = fVar81 * (fVar250 - fVar278) * 3.0;
    fVar124 = fVar81 * (fVar258 - fVar279) * 3.0;
    fVar125 = fVar81 * (fVar270 - fVar281) * 3.0;
    local_3c8._4_4_ = fVar320;
    local_3c8._0_4_ = fVar319;
    fStack_3c0 = fVar321;
    fStack_3bc = 0.0;
    local_3d8._4_4_ = fVar297;
    local_3d8._0_4_ = fVar293;
    fStack_3d0 = fVar306;
    fStack_3cc = 0.0;
    auVar172._4_4_ = auVar288._8_4_;
    auVar172._0_4_ = fVar236;
    auVar172._8_4_ = auVar288._12_4_;
    auVar172._12_4_ = 0;
    local_5c8._4_4_ = fVar236 + fVar123;
    local_5c8._0_4_ = fVar226 + fVar81 * (fVar249 - fVar272) * 3.0;
    fStack_5c0 = auVar288._8_4_ + fVar124;
    fStack_5bc = auVar288._12_4_ + fVar125;
    auVar137._0_8_ = CONCAT44(auVar288._8_4_ - fVar124,fVar236 - fVar123);
    auVar137._8_4_ = auVar288._12_4_ - fVar125;
    auVar137._12_4_ = 0;
    local_4f8._0_4_ = fVar319 - fVar316;
    local_4f8._4_4_ = fVar320 - fVar319;
    fStack_4f0 = fVar321 - fVar320;
    fStack_4ec = 0.0 - fVar321;
    local_308._0_4_ = fVar293 - fVar291;
    local_308._4_4_ = fVar297 - fVar293;
    fStack_300 = fVar306 - fVar297;
    fStack_2fc = 0.0 - fVar306;
    fVar151 = local_398 * (float)local_308._0_4_ - local_3a8 * (float)local_4f8._0_4_;
    fVar152 = fStack_394 * (float)local_308._4_4_ - fStack_3a4 * (float)local_4f8._4_4_;
    fVar153 = fStack_390 * fStack_300 - fStack_3a0 * fStack_4f0;
    fVar163 = fStack_38c * fStack_2fc - fStack_39c * fStack_4ec;
    local_3b8._4_4_ = fStack_4b0;
    local_3b8._0_4_ = fStack_4b4;
    fStack_3b0 = fStack_4ac;
    fStack_3ac = 0.0;
    local_318._0_4_ = fStack_4b4 - local_4b8;
    local_318._4_4_ = fStack_4b0 - fStack_4b4;
    fStack_310 = fStack_4ac - fStack_4b0;
    fStack_30c = 0.0 - fStack_4ac;
    fVar165 = local_3a8 * (float)local_318._0_4_ - local_388 * (float)local_308._0_4_;
    fVar184 = fStack_3a4 * (float)local_318._4_4_ - fStack_384 * (float)local_308._4_4_;
    fVar185 = fStack_3a0 * fStack_310 - fStack_380 * fStack_300;
    fVar186 = fStack_39c * fStack_30c - fStack_37c * fStack_2fc;
    fVar226 = local_388 * (float)local_4f8._0_4_ - local_398 * (float)local_318._0_4_;
    fVar236 = fStack_384 * (float)local_4f8._4_4_ - fStack_394 * (float)local_318._4_4_;
    fVar237 = fStack_380 * fStack_4f0 - fStack_390 * fStack_310;
    fVar238 = fStack_37c * fStack_4ec - fStack_38c * fStack_30c;
    auVar244._0_4_ =
         (float)local_4f8._0_4_ * (float)local_4f8._0_4_ +
         (float)local_308._0_4_ * (float)local_308._0_4_;
    auVar244._4_4_ =
         (float)local_4f8._4_4_ * (float)local_4f8._4_4_ +
         (float)local_308._4_4_ * (float)local_308._4_4_;
    auVar244._8_4_ = fStack_4f0 * fStack_4f0 + fStack_300 * fStack_300;
    auVar244._12_4_ = fStack_4ec * fStack_4ec + fStack_2fc * fStack_2fc;
    auVar228._0_4_ = (float)local_318._0_4_ * (float)local_318._0_4_ + auVar244._0_4_;
    auVar228._4_4_ = (float)local_318._4_4_ * (float)local_318._4_4_ + auVar244._4_4_;
    auVar228._8_4_ = fStack_310 * fStack_310 + auVar244._8_4_;
    auVar228._12_4_ = fStack_30c * fStack_30c + auVar244._12_4_;
    auVar82 = rcpps(auVar244,auVar228);
    fVar81 = auVar82._0_4_;
    fVar123 = auVar82._4_4_;
    fVar124 = auVar82._8_4_;
    fVar125 = auVar82._12_4_;
    fVar81 = (1.0 - fVar81 * auVar228._0_4_) * fVar81 + fVar81;
    fVar123 = (1.0 - fVar123 * auVar228._4_4_) * fVar123 + fVar123;
    fVar124 = (1.0 - fVar124 * auVar228._8_4_) * fVar124 + fVar124;
    fVar125 = (1.0 - fVar125 * auVar228._12_4_) * fVar125 + fVar125;
    fVar249 = (float)local_308._0_4_ * fStack_394 - (float)local_4f8._0_4_ * fStack_3a4;
    fVar250 = (float)local_308._4_4_ * fStack_390 - (float)local_4f8._4_4_ * fStack_3a0;
    fVar258 = fStack_300 * fStack_38c - fStack_4f0 * fStack_39c;
    fVar270 = fStack_2fc * 0.0 - fStack_4ec * 0.0;
    local_408 = fStack_3a4;
    fStack_404 = fStack_3a0;
    fStack_400 = fStack_39c;
    fStack_3fc = 0.0;
    fVar271 = (float)local_318._0_4_ * fStack_3a4 - (float)local_308._0_4_ * fStack_384;
    fVar307 = (float)local_318._4_4_ * fStack_3a0 - (float)local_308._4_4_ * fStack_380;
    fVar253 = fStack_310 * fStack_39c - fStack_300 * fStack_37c;
    fVar256 = fStack_30c * 0.0 - fStack_2fc * 0.0;
    local_3f8 = fStack_394;
    fStack_3f4 = fStack_390;
    fStack_3f0 = fStack_38c;
    fStack_3ec = 0.0;
    local_3e8._4_4_ = fStack_380;
    local_3e8._0_4_ = fStack_384;
    fStack_3e0 = fStack_37c;
    fStack_3dc = 0.0;
    fVar257 = (float)local_4f8._0_4_ * fStack_384 - (float)local_318._0_4_ * fStack_394;
    fVar272 = (float)local_4f8._4_4_ * fStack_380 - (float)local_318._4_4_ * fStack_390;
    fVar278 = fStack_4f0 * fStack_37c - fStack_310 * fStack_38c;
    fVar279 = fStack_4ec * 0.0 - fStack_30c * 0.0;
    auVar214._0_4_ = (fVar151 * fVar151 + fVar165 * fVar165 + fVar226 * fVar226) * fVar81;
    auVar214._4_4_ = (fVar152 * fVar152 + fVar184 * fVar184 + fVar236 * fVar236) * fVar123;
    auVar214._8_4_ = (fVar153 * fVar153 + fVar185 * fVar185 + fVar237 * fVar237) * fVar124;
    auVar214._12_4_ = (fVar163 * fVar163 + fVar186 * fVar186 + fVar238 * fVar238) * fVar125;
    auVar254._0_4_ = (fVar249 * fVar249 + fVar271 * fVar271 + fVar257 * fVar257) * fVar81;
    auVar254._4_4_ = (fVar250 * fVar250 + fVar307 * fVar307 + fVar272 * fVar272) * fVar123;
    auVar254._8_4_ = (fVar258 * fVar258 + fVar253 * fVar253 + fVar278 * fVar278) * fVar124;
    auVar254._12_4_ = (fVar270 * fVar270 + fVar256 * fVar256 + fVar279 * fVar279) * fVar125;
    auVar263 = maxps(auVar214,auVar254);
    auVar103._8_4_ = auVar288._8_4_;
    auVar103._0_8_ = auVar288._0_8_;
    auVar103._12_4_ = auVar288._12_4_;
    auVar82 = maxps(auVar103,_local_5c8);
    auVar245._8_4_ = auVar137._8_4_;
    auVar245._0_8_ = auVar137._0_8_;
    auVar245._12_4_ = 0;
    auVar155 = maxps(auVar245,auVar172);
    auVar82 = maxps(auVar82,auVar155);
    auVar289 = minps(auVar288,_local_5c8);
    auVar155 = minps(auVar137,auVar172);
    auVar289 = minps(auVar289,auVar155);
    auVar155 = sqrtps(auVar155,auVar263);
    auVar263 = rsqrtps(auVar172,auVar228);
    fVar81 = auVar263._0_4_;
    fVar123 = auVar263._4_4_;
    fVar124 = auVar263._8_4_;
    fVar125 = auVar263._12_4_;
    fVar151 = fVar81 * fVar81 * auVar228._0_4_ * -0.5 * fVar81 + fVar81 * 1.5;
    fVar152 = fVar123 * fVar123 * auVar228._4_4_ * -0.5 * fVar123 + fVar123 * 1.5;
    fVar153 = fVar124 * fVar124 * auVar228._8_4_ * -0.5 * fVar124 + fVar124 * 1.5;
    fVar163 = fVar125 * fVar125 * auVar228._12_4_ * -0.5 * fVar125 + fVar125 * 1.5;
    fVar281 = 0.0 - fVar316;
    fVar295 = 0.0 - fVar319;
    fVar303 = 0.0 - fVar320;
    fVar304 = 0.0 - fVar321;
    fVar257 = 0.0 - fVar291;
    fVar272 = 0.0 - fVar293;
    fVar278 = 0.0 - fVar297;
    fVar279 = 0.0 - fVar306;
    fVar249 = 0.0 - local_4b8;
    fVar258 = 0.0 - fStack_4b4;
    fVar271 = 0.0 - fStack_4b0;
    fVar253 = 0.0 - fStack_4ac;
    auVar34._4_4_ = fStack_2f4;
    auVar34._0_4_ = local_2f8;
    auVar34._8_4_ = fStack_2f0;
    auVar34._12_4_ = fStack_2ec;
    auVar229._0_4_ = local_528 * (float)local_308._0_4_ * fVar151;
    auVar229._4_4_ = fStack_524 * (float)local_308._4_4_ * fVar152;
    auVar229._8_4_ = fStack_520 * fStack_300 * fVar153;
    auVar229._12_4_ = fStack_51c * fStack_2fc * fVar163;
    fVar165 = local_2f8 * (float)local_318._0_4_ * fVar151 +
              local_458 * (float)local_4f8._0_4_ * fVar151 + auVar229._0_4_;
    fVar184 = fStack_2f4 * (float)local_318._4_4_ * fVar152 +
              fStack_454 * (float)local_4f8._4_4_ * fVar152 + auVar229._4_4_;
    fVar185 = fStack_2f0 * fStack_310 * fVar153 + fStack_450 * fStack_4f0 * fVar153 + auVar229._8_4_
    ;
    fVar186 = fStack_2ec * fStack_30c * fVar163 +
              fStack_44c * fStack_4ec * fVar163 + auVar229._12_4_;
    local_4c8 = (float)local_318._0_4_ * fVar151 * fVar249 +
                (float)local_4f8._0_4_ * fVar151 * fVar281 +
                (float)local_308._0_4_ * fVar151 * fVar257;
    fStack_4c4 = (float)local_318._4_4_ * fVar152 * fVar258 +
                 (float)local_4f8._4_4_ * fVar152 * fVar295 +
                 (float)local_308._4_4_ * fVar152 * fVar272;
    fStack_4c0 = fStack_310 * fVar153 * fVar271 +
                 fStack_4f0 * fVar153 * fVar303 + fStack_300 * fVar153 * fVar278;
    fStack_4bc = fStack_30c * fVar163 * fVar253 +
                 fStack_4ec * fVar163 * fVar304 + fStack_2fc * fVar163 * fVar279;
    local_328 = (local_2f8 * fVar249 + local_458 * fVar281 + local_528 * fVar257) -
                fVar165 * local_4c8;
    fStack_324 = (fStack_2f4 * fVar258 + fStack_454 * fVar295 + fStack_524 * fVar272) -
                 fVar184 * fStack_4c4;
    fStack_320 = (fStack_2f0 * fVar271 + fStack_450 * fVar303 + fStack_520 * fVar278) -
                 fVar185 * fStack_4c0;
    fStack_31c = (fStack_2ec * fVar253 + fStack_44c * fVar304 + fStack_51c * fVar279) -
                 fVar186 * fStack_4bc;
    fVar305 = (fVar249 * fVar249 + fVar281 * fVar281 + fVar257 * fVar257) - local_4c8 * local_4c8;
    fVar308 = (fVar258 * fVar258 + fVar295 * fVar295 + fVar272 * fVar272) - fStack_4c4 * fStack_4c4;
    fVar313 = (fVar271 * fVar271 + fVar303 * fVar303 + fVar278 * fVar278) - fStack_4c0 * fStack_4c0;
    fVar314 = (fVar253 * fVar253 + fVar304 * fVar304 + fVar279 * fVar279) - fStack_4bc * fStack_4bc;
    fVar81 = (auVar82._0_4_ + auVar155._0_4_) * 1.0000002;
    fVar123 = (auVar82._4_4_ + auVar155._4_4_) * 1.0000002;
    fVar124 = (auVar82._8_4_ + auVar155._8_4_) * 1.0000002;
    fVar125 = (auVar82._12_4_ + auVar155._12_4_) * 1.0000002;
    fVar226 = fVar305 - fVar81 * fVar81;
    fVar236 = fVar308 - fVar123 * fVar123;
    fVar237 = fVar313 - fVar124 * fVar124;
    fVar238 = fVar314 - fVar125 * fVar125;
    fVar81 = fVar165 * fVar165;
    fVar123 = fVar184 * fVar184;
    fVar124 = fVar185 * fVar185;
    fVar125 = fVar186 * fVar186;
    fVar250 = local_148 - fVar81;
    fVar270 = fStack_144 - fVar123;
    fVar307 = fStack_140 - fVar124;
    fVar256 = fStack_13c - fVar125;
    local_328 = local_328 + local_328;
    fStack_324 = fStack_324 + fStack_324;
    fStack_320 = fStack_320 + fStack_320;
    fStack_31c = fStack_31c + fStack_31c;
    local_448 = local_328 * local_328;
    fStack_444 = fStack_324 * fStack_324;
    fStack_440 = fStack_320 * fStack_320;
    fStack_43c = fStack_31c * fStack_31c;
    local_4e8._0_4_ = fVar250 * 4.0;
    local_4e8._4_4_ = fVar270 * 4.0;
    fStack_4e0 = fVar307 * 4.0;
    fStack_4dc = fVar256 * 4.0;
    auVar104._0_4_ = local_448 - (float)local_4e8._0_4_ * fVar226;
    auVar104._4_4_ = fStack_444 - (float)local_4e8._4_4_ * fVar236;
    auVar104._8_4_ = fStack_440 - fStack_4e0 * fVar237;
    auVar104._12_4_ = fStack_43c - fStack_4dc * fVar238;
    local_588._4_4_ = (auVar289._4_4_ - auVar155._4_4_) * 0.99999976;
    local_588._0_4_ = (auVar289._0_4_ - auVar155._0_4_) * 0.99999976;
    fStack_580 = (auVar289._8_4_ - auVar155._8_4_) * 0.99999976;
    fStack_57c = (auVar289._12_4_ - auVar155._12_4_) * 0.99999976;
    auVar215._4_4_ = -(uint)(0.0 <= auVar104._4_4_);
    auVar215._0_4_ = -(uint)(0.0 <= auVar104._0_4_);
    auVar215._8_4_ = -(uint)(0.0 <= auVar104._8_4_);
    auVar215._12_4_ = -(uint)(0.0 <= auVar104._12_4_);
    uVar65 = (undefined4)((ulong)lVar72 >> 0x20);
    iVar60 = movmskps((int)lVar72,auVar215);
    if (iVar60 == 0) {
      iVar60 = 0;
      auVar255 = _DAT_01f7aa00;
      auVar317 = _DAT_01f7a9f0;
    }
    else {
      auVar155 = sqrtps(auVar34,auVar104);
      bVar25 = 0.0 <= auVar104._0_4_;
      uVar78 = -(uint)bVar25;
      bVar26 = 0.0 <= auVar104._4_4_;
      uVar75 = -(uint)bVar26;
      bVar27 = 0.0 <= auVar104._8_4_;
      uVar77 = -(uint)bVar27;
      bVar28 = 0.0 <= auVar104._12_4_;
      uVar79 = -(uint)bVar28;
      auVar138._0_4_ = fVar250 + fVar250;
      auVar138._4_4_ = fVar270 + fVar270;
      auVar138._8_4_ = fVar307 + fVar307;
      auVar138._12_4_ = fVar256 + fVar256;
      auVar82 = rcpps(auVar229,auVar138);
      fVar294 = auVar82._0_4_;
      fVar296 = auVar82._4_4_;
      fVar251 = auVar82._8_4_;
      fVar252 = auVar82._12_4_;
      fVar294 = (1.0 - auVar138._0_4_ * fVar294) * fVar294 + fVar294;
      fVar296 = (1.0 - auVar138._4_4_ * fVar296) * fVar296 + fVar296;
      fVar251 = (1.0 - auVar138._8_4_ * fVar251) * fVar251 + fVar251;
      fVar252 = (1.0 - auVar138._12_4_ * fVar252) * fVar252 + fVar252;
      fVar315 = (-local_328 - auVar155._0_4_) * fVar294;
      fVar280 = (-fStack_324 - auVar155._4_4_) * fVar296;
      fVar282 = (-fStack_320 - auVar155._8_4_) * fVar251;
      fVar292 = (-fStack_31c - auVar155._12_4_) * fVar252;
      fVar294 = (auVar155._0_4_ - local_328) * fVar294;
      fVar296 = (auVar155._4_4_ - fStack_324) * fVar296;
      fVar251 = (auVar155._8_4_ - fStack_320) * fVar251;
      fVar252 = (auVar155._12_4_ - fStack_31c) * fVar252;
      local_1f8 = (fVar165 * fVar315 + local_4c8) * fVar151;
      fStack_1f4 = (fVar184 * fVar280 + fStack_4c4) * fVar152;
      fStack_1f0 = (fVar185 * fVar282 + fStack_4c0) * fVar153;
      fStack_1ec = (fVar186 * fVar292 + fStack_4bc) * fVar163;
      local_468._4_4_ = (fVar184 * fVar296 + fStack_4c4) * fVar152;
      local_468._0_4_ = (fVar165 * fVar294 + local_4c8) * fVar151;
      fStack_460 = (fVar185 * fVar251 + fStack_4c0) * fVar153;
      fStack_45c = (fVar186 * fVar252 + fStack_4bc) * fVar163;
      auVar139._0_4_ = (uint)fVar315 & uVar78;
      auVar139._4_4_ = (uint)fVar280 & uVar75;
      auVar139._8_4_ = (uint)fVar282 & uVar77;
      auVar139._12_4_ = (uint)fVar292 & uVar79;
      auVar317._0_8_ = CONCAT44(~uVar75,~uVar78) & 0x7f8000007f800000;
      auVar317._8_4_ = ~uVar77 & 0x7f800000;
      auVar317._12_4_ = ~uVar79 & 0x7f800000;
      auVar317 = auVar317 | auVar139;
      auVar309._0_4_ = (uint)fVar294 & uVar78;
      auVar309._4_4_ = (uint)fVar296 & uVar75;
      auVar309._8_4_ = (uint)fVar251 & uVar77;
      auVar309._12_4_ = (uint)fVar252 & uVar79;
      auVar255._0_8_ = CONCAT44(~uVar75,~uVar78) & 0xff800000ff800000;
      auVar255._8_4_ = ~uVar77 & 0xff800000;
      auVar255._12_4_ = ~uVar79 & 0xff800000;
      auVar255 = auVar255 | auVar309;
      auVar230._0_8_ = CONCAT44(fVar123,fVar81) & 0x7fffffff7fffffff;
      auVar230._8_4_ = ABS(fVar124);
      auVar230._12_4_ = ABS(fVar125);
      auVar35._4_4_ = fStack_294;
      auVar35._0_4_ = local_298;
      auVar35._8_4_ = fStack_290;
      auVar35._12_4_ = fStack_28c;
      auVar82 = maxps(auVar35,auVar230);
      fVar315 = auVar82._0_4_ * 1.9073486e-06;
      fVar280 = auVar82._4_4_ * 1.9073486e-06;
      fVar282 = auVar82._8_4_ * 1.9073486e-06;
      fVar292 = auVar82._12_4_ * 1.9073486e-06;
      auVar310._0_4_ = -(uint)(ABS(fVar250) < fVar315 && bVar25);
      auVar310._4_4_ = -(uint)(ABS(fVar270) < fVar280 && bVar26);
      auVar310._8_4_ = -(uint)(ABS(fVar307) < fVar282 && bVar27);
      auVar310._12_4_ = -(uint)(ABS(fVar256) < fVar292 && bVar28);
      iVar60 = movmskps(iVar60,auVar310);
      if (iVar60 != 0) {
        uVar78 = -(uint)(fVar226 <= 0.0);
        uVar75 = -(uint)(fVar236 <= 0.0);
        uVar77 = -(uint)(fVar237 <= 0.0);
        uVar79 = -(uint)(fVar238 <= 0.0);
        auVar216._0_4_ = (uVar78 & 0xff800000 | ~uVar78 & 0x7f800000) & auVar310._0_4_;
        auVar216._4_4_ = (uVar75 & 0xff800000 | ~uVar75 & 0x7f800000) & auVar310._4_4_;
        auVar216._8_4_ = (uVar77 & 0xff800000 | ~uVar77 & 0x7f800000) & auVar310._8_4_;
        auVar216._12_4_ = (uVar79 & 0xff800000 | ~uVar79 & 0x7f800000) & auVar310._12_4_;
        auVar140._0_4_ = ~auVar310._0_4_ & auVar317._0_4_;
        auVar140._4_4_ = ~auVar310._4_4_ & auVar317._4_4_;
        auVar140._8_4_ = ~auVar310._8_4_ & auVar317._8_4_;
        auVar140._12_4_ = ~auVar310._12_4_ & auVar317._12_4_;
        auVar318._0_4_ = (uVar78 & 0x7f800000 | ~uVar78 & 0xff800000) & auVar310._0_4_;
        auVar318._4_4_ = (uVar75 & 0x7f800000 | ~uVar75 & 0xff800000) & auVar310._4_4_;
        auVar318._8_4_ = (uVar77 & 0x7f800000 | ~uVar77 & 0xff800000) & auVar310._8_4_;
        auVar318._12_4_ = (uVar79 & 0x7f800000 | ~uVar79 & 0xff800000) & auVar310._12_4_;
        auVar311._0_4_ = ~auVar310._0_4_ & auVar255._0_4_;
        auVar311._4_4_ = ~auVar310._4_4_ & auVar255._4_4_;
        auVar311._8_4_ = ~auVar310._8_4_ & auVar255._8_4_;
        auVar311._12_4_ = ~auVar310._12_4_ & auVar255._12_4_;
        auVar215._4_4_ = -(uint)((fVar280 <= ABS(fVar270) || fVar236 <= 0.0) && bVar26);
        auVar215._0_4_ = -(uint)((fVar315 <= ABS(fVar250) || fVar226 <= 0.0) && bVar25);
        auVar215._8_4_ = -(uint)((fVar282 <= ABS(fVar307) || fVar237 <= 0.0) && bVar27);
        auVar215._12_4_ = -(uint)((fVar292 <= ABS(fVar256) || fVar238 <= 0.0) && bVar28);
        auVar255 = auVar311 | auVar318;
        auVar317 = auVar140 | auVar216;
      }
    }
    auVar29._4_4_ = fStack_524;
    auVar29._0_4_ = local_528;
    auVar29._8_4_ = fStack_520;
    auVar29._12_4_ = fStack_51c;
    auVar217._0_4_ = (auVar215._0_4_ << 0x1f) >> 0x1f;
    auVar217._4_4_ = (auVar215._4_4_ << 0x1f) >> 0x1f;
    auVar217._8_4_ = (auVar215._8_4_ << 0x1f) >> 0x1f;
    auVar217._12_4_ = (auVar215._12_4_ << 0x1f) >> 0x1f;
    auVar217 = auVar217 & local_1e8;
    iVar60 = movmskps(iVar60,auVar217);
    if (iVar60 != 0) {
      local_518._4_4_ = fVar308;
      local_518._0_4_ = fVar305;
      fStack_510 = fVar313;
      fStack_50c = fVar314;
      local_248 = fVar81;
      fStack_244 = fVar123;
      fStack_240 = fVar124;
      fStack_23c = fVar125;
      local_238 = fVar165;
      fStack_234 = fVar184;
      fStack_230 = fVar185;
      fStack_22c = fVar186;
      local_2b8 = fVar250;
      fStack_2b4 = fVar270;
      fStack_2b0 = fVar307;
      fStack_2ac = fVar256;
      local_2a8 = fVar151;
      fStack_2a4 = fVar152;
      fStack_2a0 = fVar153;
      fStack_29c = fVar163;
      auVar246._0_4_ = (ray->super_RayK<1>).org.field_0.m128[3] - (float)local_2e8._0_4_;
      auVar246._4_4_ = auVar246._0_4_;
      auVar246._8_4_ = auVar246._0_4_;
      auVar246._12_4_ = auVar246._0_4_;
      auVar263 = maxps(auVar246,auVar317);
      auVar156._0_4_ = (ray->super_RayK<1>).tfar - (float)local_2e8._0_4_;
      auVar156._4_4_ = auVar156._0_4_;
      auVar156._8_4_ = auVar156._0_4_;
      auVar156._12_4_ = auVar156._0_4_;
      auVar155 = minps(auVar156,auVar255);
      auVar264._0_4_ = local_388 * local_2f8 + local_398 * local_458 + local_3a8 * local_528;
      auVar264._4_4_ = fStack_384 * fStack_2f4 + fStack_394 * fStack_454 + fStack_3a4 * fStack_524;
      auVar264._8_4_ = fStack_380 * fStack_2f0 + fStack_390 * fStack_450 + fStack_3a0 * fStack_520;
      auVar264._12_4_ = fStack_37c * fStack_2ec + fStack_38c * fStack_44c + fStack_39c * fStack_51c;
      auVar82 = rcpps(auVar29,auVar264);
      fVar226 = auVar82._0_4_;
      fVar236 = auVar82._4_4_;
      fVar237 = auVar82._8_4_;
      fVar238 = auVar82._12_4_;
      fVar226 = ((1.0 - auVar264._0_4_ * fVar226) * fVar226 + fVar226) *
                -(fVar249 * local_388 + fVar281 * local_398 + fVar257 * local_3a8);
      fVar236 = ((1.0 - auVar264._4_4_ * fVar236) * fVar236 + fVar236) *
                -(fVar258 * fStack_384 + fVar295 * fStack_394 + fVar272 * fStack_3a4);
      fVar237 = ((1.0 - auVar264._8_4_ * fVar237) * fVar237 + fVar237) *
                -(fVar271 * fStack_380 + fVar303 * fStack_390 + fVar278 * fStack_3a0);
      fVar238 = ((1.0 - auVar264._12_4_ * fVar238) * fVar238 + fVar238) *
                -(fVar253 * fStack_37c + fVar304 * fStack_38c + fVar279 * fStack_39c);
      uVar78 = -(uint)(auVar264._0_4_ < 0.0 || ABS(auVar264._0_4_) < 1e-18);
      uVar75 = -(uint)(auVar264._4_4_ < 0.0 || ABS(auVar264._4_4_) < 1e-18);
      uVar77 = -(uint)(auVar264._8_4_ < 0.0 || ABS(auVar264._8_4_) < 1e-18);
      uVar79 = -(uint)(auVar264._12_4_ < 0.0 || ABS(auVar264._12_4_) < 1e-18);
      auVar188._0_8_ = CONCAT44(uVar75,uVar78) & 0xff800000ff800000;
      auVar188._8_4_ = uVar77 & 0xff800000;
      auVar188._12_4_ = uVar79 & 0xff800000;
      auVar105._0_4_ = ~uVar78 & (uint)fVar226;
      auVar105._4_4_ = ~uVar75 & (uint)fVar236;
      auVar105._8_4_ = ~uVar77 & (uint)fVar237;
      auVar105._12_4_ = ~uVar79 & (uint)fVar238;
      auVar263 = maxps(auVar263,auVar105 | auVar188);
      uVar78 = -(uint)(0.0 < auVar264._0_4_ || ABS(auVar264._0_4_) < 1e-18);
      uVar75 = -(uint)(0.0 < auVar264._4_4_ || ABS(auVar264._4_4_) < 1e-18);
      uVar77 = -(uint)(0.0 < auVar264._8_4_ || ABS(auVar264._8_4_) < 1e-18);
      uVar79 = -(uint)(0.0 < auVar264._12_4_ || ABS(auVar264._12_4_) < 1e-18);
      auVar106._0_8_ = CONCAT44(uVar75,uVar78) & 0x7f8000007f800000;
      auVar106._8_4_ = uVar77 & 0x7f800000;
      auVar106._12_4_ = uVar79 & 0x7f800000;
      auVar265._0_4_ = ~uVar78 & (uint)fVar226;
      auVar265._4_4_ = ~uVar75 & (uint)fVar236;
      auVar265._8_4_ = ~uVar77 & (uint)fVar237;
      auVar265._12_4_ = ~uVar79 & (uint)fVar238;
      auVar155 = minps(auVar155,auVar265 | auVar106);
      auVar141._0_4_ = (0.0 - fVar319) * -fStack_394 + (0.0 - fVar293) * -fStack_3a4;
      auVar141._4_4_ = (0.0 - fVar320) * -fStack_390 + (0.0 - fVar297) * -fStack_3a0;
      auVar141._8_4_ = (0.0 - fVar321) * -fStack_38c + (0.0 - fVar306) * -fStack_39c;
      auVar141._12_4_ = 0x80000000;
      auVar266._0_4_ = -fStack_384 * local_2f8 + -fStack_394 * local_458 + -fStack_3a4 * local_528;
      auVar266._4_4_ =
           -fStack_380 * fStack_2f4 + -fStack_390 * fStack_454 + -fStack_3a0 * fStack_524;
      auVar266._8_4_ =
           -fStack_37c * fStack_2f0 + -fStack_38c * fStack_450 + -fStack_39c * fStack_520;
      auVar266._12_4_ = fStack_2ec * -0.0 + fStack_44c * -0.0 + fStack_51c * -0.0;
      auVar82 = rcpps(auVar141,auVar266);
      fVar226 = auVar82._0_4_;
      fVar236 = auVar82._4_4_;
      fVar237 = auVar82._8_4_;
      fVar238 = auVar82._12_4_;
      fVar226 = (((float)DAT_01f7ba10 - auVar266._0_4_ * fVar226) * fVar226 + fVar226) *
                -((0.0 - fStack_4b4) * -fStack_384 + auVar141._0_4_);
      fVar236 = ((DAT_01f7ba10._4_4_ - auVar266._4_4_ * fVar236) * fVar236 + fVar236) *
                -((0.0 - fStack_4b0) * -fStack_380 + auVar141._4_4_);
      fVar237 = ((DAT_01f7ba10._8_4_ - auVar266._8_4_ * fVar237) * fVar237 + fVar237) *
                -((0.0 - fStack_4ac) * -fStack_37c + auVar141._8_4_);
      fVar238 = ((DAT_01f7ba10._12_4_ - auVar266._12_4_ * fVar238) * fVar238 + fVar238) * 0.0;
      uVar78 = -(uint)(auVar266._0_4_ < 0.0 || ABS(auVar266._0_4_) < 1e-18);
      uVar75 = -(uint)(auVar266._4_4_ < 0.0 || ABS(auVar266._4_4_) < 1e-18);
      uVar77 = -(uint)(auVar266._8_4_ < 0.0 || ABS(auVar266._8_4_) < 1e-18);
      uVar79 = -(uint)(auVar266._12_4_ < 0.0 || ABS(auVar266._12_4_) < 1e-18);
      auVar142._0_8_ = CONCAT44(uVar75,uVar78) & 0xff800000ff800000;
      auVar142._8_4_ = uVar77 & 0xff800000;
      auVar142._12_4_ = uVar79 & 0xff800000;
      auVar107._0_4_ = ~uVar78 & (uint)fVar226;
      auVar107._4_4_ = ~uVar75 & (uint)fVar236;
      auVar107._8_4_ = ~uVar77 & (uint)fVar237;
      auVar107._12_4_ = ~uVar79 & (uint)fVar238;
      _local_438 = maxps(auVar263,auVar107 | auVar142);
      uVar78 = -(uint)(0.0 < auVar266._0_4_ || ABS(auVar266._0_4_) < 1e-18);
      uVar75 = -(uint)(0.0 < auVar266._4_4_ || ABS(auVar266._4_4_) < 1e-18);
      uVar77 = -(uint)(0.0 < auVar266._8_4_ || ABS(auVar266._8_4_) < 1e-18);
      uVar79 = -(uint)(0.0 < auVar266._12_4_ || ABS(auVar266._12_4_) < 1e-18);
      auVar108._0_8_ = CONCAT44(uVar75,uVar78) & 0x7f8000007f800000;
      auVar108._8_4_ = uVar77 & 0x7f800000;
      auVar108._12_4_ = uVar79 & 0x7f800000;
      auVar267._0_4_ = ~uVar78 & (uint)fVar226;
      auVar267._4_4_ = ~uVar75 & (uint)fVar236;
      auVar267._8_4_ = ~uVar77 & (uint)fVar237;
      auVar267._12_4_ = ~uVar79 & (uint)fVar238;
      auVar82 = minps(auVar155,auVar267 | auVar108);
      fVar226 = local_438._12_4_;
      fVar236 = local_438._0_4_;
      fVar237 = local_438._4_4_;
      fVar238 = local_438._8_4_;
      auVar312._0_4_ = -(uint)(fVar236 <= auVar82._0_4_) & auVar217._0_4_;
      auVar312._4_4_ = -(uint)(fVar237 <= auVar82._4_4_) & auVar217._4_4_;
      auVar312._8_4_ = -(uint)(fVar238 <= auVar82._8_4_) & auVar217._8_4_;
      auVar312._12_4_ = -(uint)(fVar226 <= auVar82._12_4_) & auVar217._12_4_;
      iVar60 = movmskps(iVar60,auVar312);
      if (iVar60 != 0) {
        auVar155 = maxps(ZEXT816(0),_local_588);
        auVar37._4_4_ = fStack_1f4;
        auVar37._0_4_ = local_1f8;
        auVar37._8_4_ = fStack_1f0;
        auVar37._12_4_ = fStack_1ec;
        auVar263 = minps(auVar37,_DAT_01f7ba10);
        auVar189._0_12_ = ZEXT812(0);
        auVar189._12_4_ = 0.0;
        auVar289 = maxps(auVar263,auVar189);
        auVar263 = minps(_local_468,_DAT_01f7ba10);
        auVar263 = maxps(auVar263,auVar189);
        local_108._0_4_ = (auVar289._0_4_ + 0.0) * 0.25 * (float)local_418._4_4_ + local_1d8;
        local_108._4_4_ = (auVar289._4_4_ + 1.0) * 0.25 * (float)local_418._4_4_ + local_1d8;
        local_108._8_4_ = (auVar289._8_4_ + 2.0) * 0.25 * (float)local_418._4_4_ + local_1d8;
        local_108._12_4_ = (auVar289._12_4_ + 3.0) * 0.25 * (float)local_418._4_4_ + local_1d8;
        local_118[0] = (auVar263._0_4_ + 0.0) * 0.25 * (float)local_418._4_4_ + local_1d8;
        local_118[1] = (auVar263._4_4_ + 1.0) * 0.25 * (float)local_418._4_4_ + local_1d8;
        local_118[2] = (auVar263._8_4_ + 2.0) * 0.25 * (float)local_418._4_4_ + local_1d8;
        local_118[3] = (auVar263._12_4_ + 3.0) * 0.25 * (float)local_418._4_4_ + local_1d8;
        local_518._0_4_ = fVar305 - auVar155._0_4_ * auVar155._0_4_;
        local_518._4_4_ = fVar308 - auVar155._4_4_ * auVar155._4_4_;
        fStack_510 = fVar313 - auVar155._8_4_ * auVar155._8_4_;
        fStack_50c = fVar314 - auVar155._12_4_ * auVar155._12_4_;
        auVar173._0_4_ = local_448 - (float)local_4e8._0_4_ * (float)local_518._0_4_;
        auVar173._4_4_ = fStack_444 - (float)local_4e8._4_4_ * (float)local_518._4_4_;
        auVar173._8_4_ = fStack_440 - fStack_4e0 * fStack_510;
        auVar173._12_4_ = fStack_43c - fStack_4dc * fStack_50c;
        local_468._4_4_ = -(uint)(0.0 <= auVar173._4_4_);
        local_468._0_4_ = -(uint)(0.0 <= auVar173._0_4_);
        fStack_460 = (float)-(uint)(0.0 <= auVar173._8_4_);
        fStack_45c = (float)-(uint)(0.0 <= auVar173._12_4_);
        iVar60 = movmskps(iVar60,_local_468);
        if (iVar60 == 0) {
          _local_588 = ZEXT816(0);
          fVar165 = 0.0;
          fVar184 = 0.0;
          fVar185 = 0.0;
          fVar186 = 0.0;
          fVar257 = 0.0;
          fVar272 = 0.0;
          fVar278 = 0.0;
          fVar279 = 0.0;
          fVar249 = 0.0;
          fVar258 = 0.0;
          fVar271 = 0.0;
          fVar253 = 0.0;
          _local_4e8 = ZEXT816(0);
          iVar60 = 0;
          auVar143 = _DAT_01f7aa00;
          auVar174 = _DAT_01f7a9f0;
        }
        else {
          auVar263 = sqrtps(local_108,auVar173);
          auVar109._0_4_ = fVar250 + fVar250;
          auVar109._4_4_ = fVar270 + fVar270;
          auVar109._8_4_ = fVar307 + fVar307;
          auVar109._12_4_ = fVar256 + fVar256;
          auVar155 = rcpps(_local_518,auVar109);
          fVar281 = auVar155._0_4_;
          fVar295 = auVar155._4_4_;
          fVar303 = auVar155._8_4_;
          fVar304 = auVar155._12_4_;
          fVar281 = ((float)DAT_01f7ba10 - auVar109._0_4_ * fVar281) * fVar281 + fVar281;
          fVar295 = (DAT_01f7ba10._4_4_ - auVar109._4_4_ * fVar295) * fVar295 + fVar295;
          fVar303 = (DAT_01f7ba10._8_4_ - auVar109._8_4_ * fVar303) * fVar303 + fVar303;
          fVar304 = (DAT_01f7ba10._12_4_ - auVar109._12_4_ * fVar304) * fVar304 + fVar304;
          fVar315 = (-local_328 - auVar263._0_4_) * fVar281;
          fVar280 = (-fStack_324 - auVar263._4_4_) * fVar295;
          fVar282 = (-fStack_320 - auVar263._8_4_) * fVar303;
          fVar292 = (-fStack_31c - auVar263._12_4_) * fVar304;
          fVar281 = (auVar263._0_4_ - local_328) * fVar281;
          fVar295 = (auVar263._4_4_ - fStack_324) * fVar295;
          fVar303 = (auVar263._8_4_ - fStack_320) * fVar303;
          fVar304 = (auVar263._12_4_ - fStack_31c) * fVar304;
          fVar305 = (fVar165 * fVar315 + local_4c8) * fVar151;
          fVar308 = (fVar184 * fVar280 + fStack_4c4) * fVar152;
          fVar313 = (fVar185 * fVar282 + fStack_4c0) * fVar153;
          fVar314 = (fVar186 * fVar292 + fStack_4bc) * fVar163;
          fVar257 = local_2f8 * fVar315 - ((float)local_318._0_4_ * fVar305 + local_4b8);
          fVar272 = fStack_2f4 * fVar280 - ((float)local_318._4_4_ * fVar308 + fStack_4b4);
          fVar278 = fStack_2f0 * fVar282 - (fStack_310 * fVar313 + fStack_4b0);
          fVar279 = fStack_2ec * fVar292 - (fStack_30c * fVar314 + fStack_4ac);
          fVar249 = local_458 * fVar315 - ((float)local_4f8._0_4_ * fVar305 + fVar316);
          fVar258 = fStack_454 * fVar280 - ((float)local_4f8._4_4_ * fVar308 + fVar319);
          fVar271 = fStack_450 * fVar282 - (fStack_4f0 * fVar313 + fVar320);
          fVar253 = fStack_44c * fVar292 - (fStack_4ec * fVar314 + fVar321);
          local_4e8._4_4_ = fStack_524 * fVar280 - (fVar308 * (float)local_308._4_4_ + fVar293);
          local_4e8._0_4_ = local_528 * fVar315 - (fVar305 * (float)local_308._0_4_ + fVar291);
          fStack_4e0 = fStack_520 * fVar282 - (fVar313 * fStack_300 + fVar297);
          fStack_4dc = fStack_51c * fVar292 - (fVar314 * fStack_2fc + fVar306);
          fVar151 = (fVar165 * fVar281 + local_4c8) * fVar151;
          fVar152 = (fVar184 * fVar295 + fStack_4c4) * fVar152;
          fVar153 = (fVar185 * fVar303 + fStack_4c0) * fVar153;
          fVar163 = (fVar186 * fVar304 + fStack_4bc) * fVar163;
          local_588._4_4_ = fStack_2f4 * fVar295 - ((float)local_318._4_4_ * fVar152 + fStack_4b4);
          local_588._0_4_ = local_2f8 * fVar281 - ((float)local_318._0_4_ * fVar151 + local_4b8);
          fStack_580 = fStack_2f0 * fVar303 - (fStack_310 * fVar153 + fStack_4b0);
          fStack_57c = fStack_2ec * fVar304 - (fStack_30c * fVar163 + fStack_4ac);
          fVar165 = local_458 * fVar281 - ((float)local_4f8._0_4_ * fVar151 + fVar316);
          fVar184 = fStack_454 * fVar295 - ((float)local_4f8._4_4_ * fVar152 + fVar319);
          fVar185 = fStack_450 * fVar303 - (fStack_4f0 * fVar153 + fVar320);
          fVar186 = fStack_44c * fVar304 - (fStack_4ec * fVar163 + fVar321);
          bVar25 = 0.0 <= auVar173._0_4_;
          uVar78 = -(uint)bVar25;
          bVar26 = 0.0 <= auVar173._4_4_;
          uVar75 = -(uint)bVar26;
          bVar27 = 0.0 <= auVar173._8_4_;
          uVar77 = -(uint)bVar27;
          bVar28 = 0.0 <= auVar173._12_4_;
          uVar79 = -(uint)bVar28;
          auVar189._0_4_ = local_528 * fVar281 - (fVar151 * (float)local_308._0_4_ + fVar291);
          auVar189._4_4_ = fStack_524 * fVar295 - (fVar152 * (float)local_308._4_4_ + fVar293);
          auVar189._8_4_ = fStack_520 * fVar303 - (fVar153 * fStack_300 + fVar297);
          auVar189._12_4_ = fStack_51c * fVar304 - (fVar163 * fStack_2fc + fVar306);
          auVar231._0_4_ = (uint)fVar315 & uVar78;
          auVar231._4_4_ = (uint)fVar280 & uVar75;
          auVar231._8_4_ = (uint)fVar282 & uVar77;
          auVar231._12_4_ = (uint)fVar292 & uVar79;
          auVar174._0_8_ = CONCAT44(~uVar75,~uVar78) & 0x7f8000007f800000;
          auVar174._8_4_ = ~uVar77 & 0x7f800000;
          auVar174._12_4_ = ~uVar79 & 0x7f800000;
          auVar174 = auVar174 | auVar231;
          auVar247._0_4_ = (uint)fVar281 & uVar78;
          auVar247._4_4_ = (uint)fVar295 & uVar75;
          auVar247._8_4_ = (uint)fVar303 & uVar77;
          auVar247._12_4_ = (uint)fVar304 & uVar79;
          auVar143._0_8_ = CONCAT44(~uVar75,~uVar78) & 0xff800000ff800000;
          auVar143._8_4_ = ~uVar77 & 0xff800000;
          auVar143._12_4_ = ~uVar79 & 0xff800000;
          auVar143 = auVar143 | auVar247;
          auVar218._0_8_ = CONCAT44(fVar123,fVar81) & 0x7fffffff7fffffff;
          auVar218._8_4_ = ABS(fVar124);
          auVar218._12_4_ = ABS(fVar125);
          auVar36._4_4_ = fStack_294;
          auVar36._0_4_ = local_298;
          auVar36._8_4_ = fStack_290;
          auVar36._12_4_ = fStack_28c;
          auVar155 = maxps(auVar36,auVar218);
          fVar81 = auVar155._0_4_ * 1.9073486e-06;
          fVar123 = auVar155._4_4_ * 1.9073486e-06;
          fVar124 = auVar155._8_4_ * 1.9073486e-06;
          fVar125 = auVar155._12_4_ * 1.9073486e-06;
          auVar219._0_4_ = -(uint)(ABS(fVar250) < fVar81 && bVar25);
          auVar219._4_4_ = -(uint)(ABS(fVar270) < fVar123 && bVar26);
          auVar219._8_4_ = -(uint)(ABS(fVar307) < fVar124 && bVar27);
          auVar219._12_4_ = -(uint)(ABS(fVar256) < fVar125 && bVar28);
          iVar60 = movmskps(iVar60,auVar219);
          if (iVar60 != 0) {
            uVar78 = -(uint)((float)local_518._0_4_ <= 0.0);
            uVar75 = -(uint)((float)local_518._4_4_ <= 0.0);
            uVar77 = -(uint)(fStack_510 <= 0.0);
            uVar79 = -(uint)(fStack_50c <= 0.0);
            auVar268._0_4_ = (uVar78 & 0xff800000 | ~uVar78 & 0x7f800000) & auVar219._0_4_;
            auVar268._4_4_ = (uVar75 & 0xff800000 | ~uVar75 & 0x7f800000) & auVar219._4_4_;
            auVar268._8_4_ = (uVar77 & 0xff800000 | ~uVar77 & 0x7f800000) & auVar219._8_4_;
            auVar268._12_4_ = (uVar79 & 0xff800000 | ~uVar79 & 0x7f800000) & auVar219._12_4_;
            auVar277._0_4_ = ~auVar219._0_4_ & auVar174._0_4_;
            auVar277._4_4_ = ~auVar219._4_4_ & auVar174._4_4_;
            auVar277._8_4_ = ~auVar219._8_4_ & auVar174._8_4_;
            auVar277._12_4_ = ~auVar219._12_4_ & auVar174._12_4_;
            auVar269._0_4_ = (uVar78 & 0x7f800000 | ~uVar78 & 0xff800000) & auVar219._0_4_;
            auVar269._4_4_ = (uVar75 & 0x7f800000 | ~uVar75 & 0xff800000) & auVar219._4_4_;
            auVar269._8_4_ = (uVar77 & 0x7f800000 | ~uVar77 & 0xff800000) & auVar219._8_4_;
            auVar269._12_4_ = (uVar79 & 0x7f800000 | ~uVar79 & 0xff800000) & auVar219._12_4_;
            auVar220._0_4_ = ~auVar219._0_4_ & auVar143._0_4_;
            auVar220._4_4_ = ~auVar219._4_4_ & auVar143._4_4_;
            auVar220._8_4_ = ~auVar219._8_4_ & auVar143._8_4_;
            auVar220._12_4_ = ~auVar219._12_4_ & auVar143._12_4_;
            local_468._4_4_ =
                 -(uint)((fVar123 <= ABS(fVar270) || (float)local_518._4_4_ <= 0.0) && bVar26);
            local_468._0_4_ =
                 -(uint)((fVar81 <= ABS(fVar250) || (float)local_518._0_4_ <= 0.0) && bVar25);
            fStack_460 = (float)-(uint)((fVar124 <= ABS(fVar307) || fStack_510 <= 0.0) && bVar27);
            fStack_45c = (float)-(uint)((fVar125 <= ABS(fVar256) || fStack_50c <= 0.0) && bVar28);
            auVar143 = auVar220 | auVar269;
            auVar174 = auVar277 | auVar268;
          }
        }
        fVar81 = (ray->super_RayK<1>).dir.field_0.m128[0];
        fVar123 = (ray->super_RayK<1>).dir.field_0.m128[1];
        fVar124 = (ray->super_RayK<1>).dir.field_0.m128[2];
        _local_138 = _local_438;
        local_128 = minps(auVar82,auVar174);
        _local_4f8 = maxps(_local_438,auVar143);
        _local_278 = _local_4f8;
        local_268 = auVar82;
        auVar232._0_4_ = -(uint)(fVar236 <= local_128._0_4_) & auVar312._0_4_;
        auVar232._4_4_ = -(uint)(fVar237 <= local_128._4_4_) & auVar312._4_4_;
        auVar232._8_4_ = -(uint)(fVar238 <= local_128._8_4_) & auVar312._8_4_;
        auVar232._12_4_ = -(uint)(fVar226 <= local_128._12_4_) & auVar312._12_4_;
        auVar110._0_8_ =
             CONCAT44(-(uint)((float)local_4f8._4_4_ <= auVar82._4_4_) & auVar312._4_4_,
                      -(uint)((float)local_4f8._0_4_ <= auVar82._0_4_) & auVar312._0_4_);
        auVar110._8_4_ = -(uint)(fStack_4f0 <= auVar82._8_4_) & auVar312._8_4_;
        auVar110._12_4_ = -(uint)(fStack_4ec <= auVar82._12_4_) & auVar312._12_4_;
        auVar157._8_4_ = auVar110._8_4_;
        auVar157._0_8_ = auVar110._0_8_;
        auVar157._12_4_ = auVar110._12_4_;
        iVar60 = movmskps(iVar60,auVar157 | auVar232);
        if (iVar60 != 0) {
          _local_318 = auVar110;
          local_328 = fVar164;
          fStack_324 = fVar164;
          fStack_320 = fVar164;
          fStack_31c = fVar164;
          local_4e8._0_4_ =
               -(uint)((int)fVar164 <
                      ((int)((-(uint)(0.3 <= ABS((float)local_4e8._0_4_ * fVar124 +
                                                 fVar249 * fVar123 + fVar257 * fVar81)) &
                             local_468._0_4_) << 0x1f) >> 0x1f) + 4);
          local_4e8._4_4_ =
               -(uint)((int)fVar164 <
                      ((int)((-(uint)(0.3 <= ABS((float)local_4e8._4_4_ * fVar124 +
                                                 fVar258 * fVar123 + fVar272 * fVar81)) &
                             local_468._4_4_) << 0x1f) >> 0x1f) + 4);
          fStack_4e0 = (float)-(uint)((int)fVar164 <
                                     ((int)((-(uint)(0.3 <= ABS(fStack_4e0 * fVar124 +
                                                                fVar271 * fVar123 + fVar278 * fVar81
                                                               )) & (uint)fStack_460) << 0x1f) >>
                                     0x1f) + 4);
          fStack_4dc = (float)-(uint)((int)fVar164 <
                                     ((int)((-(uint)(0.3 <= ABS(fStack_4dc * fVar124 +
                                                                fVar253 * fVar123 + fVar279 * fVar81
                                                               )) & (uint)fStack_45c) << 0x1f) >>
                                     0x1f) + 4);
          _local_308 = auVar232;
          local_2d8 = ~_local_4e8 & auVar232;
          iVar60 = movmskps(iVar60,local_2d8);
          if (iVar60 == 0) {
            fVar125 = (ray->super_RayK<1>).tfar;
            auVar248._4_4_ = fVar196;
            auVar248._0_4_ = fVar195;
            auVar248._8_4_ = fVar197;
            auVar248._12_4_ = fVar224;
            fVar151 = (float)local_4f8._0_4_;
            fVar152 = (float)local_4f8._4_4_;
            fVar153 = fStack_4f0;
            fVar163 = fStack_4ec;
          }
          else {
            local_448 = local_4d8 + fVar236;
            fStack_444 = fStack_4d4 + fVar237;
            fStack_440 = fStack_4d0 + fVar238;
            fStack_43c = fStack_4cc + fVar226;
            auVar248._4_4_ = fVar196;
            auVar248._0_4_ = fVar195;
            auVar248._8_4_ = fVar197;
            auVar248._12_4_ = fVar224;
            do {
              auVar155 = ~local_2d8 & _DAT_01f7a9f0 | local_2d8 & _local_438;
              auVar175._4_4_ = auVar155._0_4_;
              auVar175._0_4_ = auVar155._4_4_;
              auVar175._8_4_ = auVar155._12_4_;
              auVar175._12_4_ = auVar155._8_4_;
              auVar82 = minps(auVar175,auVar155);
              auVar111._0_8_ = auVar82._8_8_;
              auVar111._8_4_ = auVar82._0_4_;
              auVar111._12_4_ = auVar82._4_4_;
              auVar82 = minps(auVar111,auVar82);
              auVar112._0_8_ =
                   CONCAT44(-(uint)(auVar82._4_4_ == auVar155._4_4_) & local_2d8._4_4_,
                            -(uint)(auVar82._0_4_ == auVar155._0_4_) & local_2d8._0_4_);
              auVar112._8_4_ = -(uint)(auVar82._8_4_ == auVar155._8_4_) & local_2d8._8_4_;
              auVar112._12_4_ = -(uint)(auVar82._12_4_ == auVar155._12_4_) & local_2d8._12_4_;
              iVar60 = movmskps(iVar60,auVar112);
              auVar144 = local_2d8;
              if (iVar60 != 0) {
                auVar144._8_4_ = auVar112._8_4_;
                auVar144._0_8_ = auVar112._0_8_;
                auVar144._12_4_ = auVar112._12_4_;
              }
              uVar61 = movmskps(iVar60,auVar144);
              pRVar64 = (RayHit *)0x0;
              if (CONCAT44(uVar65,uVar61) != 0) {
                for (; (CONCAT44(uVar65,uVar61) >> (long)pRVar64 & 1) == 0;
                    pRVar64 = (RayHit *)((long)(pRVar64->super_RayK<1>).org.field_0.m128 + 1)) {
                }
              }
              *(undefined4 *)(local_2d8 + (long)pRVar64 * 4) = 0;
              fVar125 = (ray->super_RayK<1>).dir.field_0.m128[0];
              fVar151 = (ray->super_RayK<1>).dir.field_0.m128[1];
              fVar152 = (ray->super_RayK<1>).dir.field_0.m128[2];
              fVar153 = (ray->super_RayK<1>).dir.field_0.m128[3];
              auVar30._4_4_ = fStack_4a4;
              auVar30._0_4_ = local_4a8;
              auVar30._8_4_ = fStack_4a0;
              auVar30._12_4_ = fStack_49c;
              auVar155 = minps(auVar248,auVar30);
              auVar263 = maxps(auVar248,auVar30);
              auVar32._4_4_ = fStack_334;
              auVar32._0_4_ = local_338;
              auVar32._8_4_ = fStack_330;
              auVar32._12_4_ = fStack_32c;
              auVar82 = minps(auVar32,_local_568);
              auVar155 = minps(auVar155,auVar82);
              auVar82 = maxps(auVar32,_local_568);
              auVar82 = maxps(auVar263,auVar82);
              auVar158._0_8_ = auVar155._0_8_ & 0x7fffffff7fffffff;
              auVar158._8_4_ = auVar155._8_4_ & 0x7fffffff;
              auVar158._12_4_ = auVar155._12_4_ & 0x7fffffff;
              local_428 = auVar82._12_4_;
              auVar113._0_8_ = auVar82._0_8_ & 0x7fffffff7fffffff;
              auVar113._8_4_ = auVar82._8_4_ & 0x7fffffff;
              auVar113._12_4_ = ABS(local_428);
              auVar82 = maxps(auVar158,auVar113);
              fVar163 = auVar82._4_4_;
              if (auVar82._4_4_ <= auVar82._0_4_) {
                fVar163 = auVar82._0_4_;
              }
              auVar159._8_8_ = auVar82._8_8_;
              auVar159._0_8_ = auVar82._8_8_;
              if (auVar82._8_4_ <= fVar163) {
                auVar159._0_4_ = fVar163;
              }
              fVar236 = auVar159._0_4_ * 1.9073486e-06;
              local_3b8._0_4_ =
                   SQRT(fVar152 * fVar152 + fVar151 * fVar151 + fVar125 * fVar125) * 1.9073486e-06;
              fStack_424 = local_428;
              fStack_420 = local_428;
              fStack_41c = local_428;
              fVar163 = *(float *)(local_108 + (long)pRVar64 * 4);
              fVar226 = *(float *)(local_138 + (long)pRVar64 * 4);
              fVar237 = 0.0;
              fVar238 = 0.0;
              lVar72 = 5;
              do {
                fVar307 = 1.0 - fVar163;
                fVar271 = local_4a8 * fVar307 + local_338 * fVar163;
                fVar256 = fStack_4a4 * fVar307 + fStack_334 * fVar163;
                fVar257 = fStack_4a0 * fVar307 + fStack_330 * fVar163;
                fVar272 = fStack_49c * fVar307 + fStack_32c * fVar163;
                fVar249 = (fVar195 * fVar307 + local_4a8 * fVar163) * fVar307 + fVar163 * fVar271;
                fVar250 = (fVar196 * fVar307 + fStack_4a4 * fVar163) * fVar307 + fVar163 * fVar256;
                fVar258 = (fVar197 * fVar307 + fStack_4a0 * fVar163) * fVar307 + fVar163 * fVar257;
                fVar270 = (fVar224 * fVar307 + fStack_49c * fVar163) * fVar307 + fVar163 * fVar272;
                fVar253 = fVar271 * fVar307 +
                          (local_338 * fVar307 + (float)local_568._0_4_ * fVar163) * fVar163;
                fVar256 = fVar256 * fVar307 +
                          (fStack_334 * fVar307 + (float)local_568._4_4_ * fVar163) * fVar163;
                fVar257 = fVar257 * fVar307 +
                          (fStack_330 * fVar307 + fStack_560 * fVar163) * fVar163;
                fVar272 = fVar272 * fVar307 +
                          (fStack_32c * fVar307 + fStack_55c * fVar163) * fVar163;
                fVar291 = fVar307 * fVar249 + fVar163 * fVar253;
                fVar293 = fVar307 * fVar250 + fVar163 * fVar256;
                fVar295 = fVar307 * fVar258 + fVar163 * fVar257;
                fVar271 = fVar307 * fVar270 + fVar163 * fVar272;
                fVar249 = (fVar253 - fVar249) * 3.0;
                fVar250 = (fVar256 - fVar250) * 3.0;
                fVar258 = (fVar257 - fVar258) * 3.0;
                fVar270 = (fVar272 - fVar270) * 3.0;
                fVar253 = fVar307 * 6.0;
                fVar272 = (fVar163 - (fVar307 + fVar307)) * 6.0;
                fVar278 = (fVar307 - (fVar163 + fVar163)) * 6.0;
                fVar257 = fVar163 * 6.0;
                fVar307 = fVar253 * fVar195 +
                          fVar272 * local_4a8 +
                          fVar278 * local_338 + fVar257 * (float)local_568._0_4_;
                fVar256 = fVar253 * fVar196 +
                          fVar272 * fStack_4a4 +
                          fVar278 * fStack_334 + fVar257 * (float)local_568._4_4_;
                fVar257 = fVar253 * fVar197 +
                          fVar272 * fStack_4a0 + fVar278 * fStack_330 + fVar257 * fStack_560;
                local_3c8._0_4_ = (fVar226 * fVar125 + 0.0) - fVar291;
                local_3c8._4_4_ = (fVar226 * fVar151 + 0.0) - fVar293;
                fStack_3c0 = (fVar226 * fVar152 + 0.0) - fVar295;
                fStack_3bc = (fVar226 * fVar153 + 0.0) - fVar271;
                fVar272 = (float)local_3c8._4_4_ * (float)local_3c8._4_4_;
                fVar278 = fStack_3c0 * fStack_3c0;
                fVar279 = fStack_3bc * fStack_3bc;
                fVar253 = fVar272 + (float)local_3c8._0_4_ * (float)local_3c8._0_4_ + fVar278;
                fVar281 = fVar272 + fVar272 + fVar279;
                fVar278 = fVar272 + fVar278 + fVar278;
                fVar279 = fVar272 + fVar279 + fVar279;
                fStack_5a4 = auVar159._4_4_;
                fStack_5a0 = auVar159._8_4_;
                fStack_59c = auVar159._12_4_;
                local_3a8 = fVar236;
                if (fVar236 <= (float)local_3b8._0_4_ * fVar226) {
                  local_3a8 = (float)local_3b8._0_4_ * fVar226;
                }
                fVar304 = fVar250 * fVar250 + fVar249 * fVar249 + fVar258 * fVar258;
                auVar82 = ZEXT416((uint)fVar304);
                auVar155 = rsqrtss(ZEXT416((uint)fVar304),auVar82);
                fVar272 = auVar155._0_4_;
                fVar305 = fVar272 * 1.5 - fVar272 * fVar272 * fVar304 * 0.5 * fVar272;
                fVar282 = fVar249 * fVar305;
                fVar292 = fVar250 * fVar305;
                fVar294 = fVar258 * fVar305;
                fStack_394 = fVar270 * fVar305;
                fVar314 = fVar258 * fVar257 + fVar250 * fVar256 + fVar249 * fVar307;
                auVar82 = rcpss(auVar82,auVar82);
                fVar303 = (2.0 - fVar304 * auVar82._0_4_) * auVar82._0_4_;
                fVar272 = (float)local_3c8._4_4_ * fVar292;
                fVar308 = fStack_3c0 * fVar294;
                fVar313 = fStack_3bc * fStack_394;
                fVar297 = fVar272 + (float)local_3c8._0_4_ * fVar282 + fVar308;
                fVar315 = fVar272 + fVar272 + fVar313;
                fVar308 = fVar272 + fVar308 + fVar308;
                fVar313 = fVar272 + fVar313 + fVar313;
                fStack_3a4 = fStack_5a4;
                fStack_3a0 = fStack_5a0;
                fStack_39c = fStack_59c;
                fVar280 = (SQRT(fVar253) + 1.0) * (fVar236 / SQRT(fVar304)) +
                          SQRT(fVar253) * fVar236 + local_3a8;
                fVar272 = fVar153 * fStack_394;
                fStack_390 = fVar294 * -fVar258;
                fStack_394 = fStack_394 * -fVar270;
                local_398 = fStack_390 + fVar292 * -fVar250 + fVar282 * -fVar249 +
                            fVar303 * (fVar304 * fVar257 - fVar314 * fVar258) * fVar305 * fStack_3c0
                            + fVar303 * (fVar304 * fVar256 - fVar314 * fVar250) * fVar305 *
                              (float)local_3c8._4_4_ +
                              fVar303 * (fVar304 * fVar307 - fVar314 * fVar249) * fVar305 *
                              (float)local_3c8._0_4_;
                fVar307 = fVar152 * fVar294 + fVar151 * fVar292 + fVar125 * fVar282;
                auVar221._4_4_ = fVar281;
                auVar221._0_4_ = fVar253;
                auVar221._8_4_ = fVar278;
                auVar221._12_4_ = fVar279;
                fVar253 = fVar253 - fVar297 * fVar297;
                auVar233._0_8_ = CONCAT44(fVar281 - fVar315 * fVar315,fVar253);
                auVar233._8_4_ = fVar278 - fVar308 * fVar308;
                auVar233._12_4_ = fVar279 - fVar313 * fVar313;
                fStack_380 = -fVar258 * fStack_3c0;
                fStack_384 = -fVar270 * fStack_3bc;
                fStack_38c = fStack_394;
                local_388 = (fStack_380 +
                            -fVar250 * (float)local_3c8._4_4_ + -fVar249 * (float)local_3c8._0_4_) -
                            fVar297 * local_398;
                fStack_37c = fStack_384;
                fVar257 = fVar153 * fStack_3bc;
                fVar256 = (fVar152 * fStack_3c0 +
                          fVar151 * (float)local_3c8._4_4_ + fVar125 * (float)local_3c8._0_4_) -
                          fVar297 * fVar307;
                auVar145._8_4_ = auVar233._8_4_;
                auVar145._0_8_ = auVar233._0_8_;
                auVar145._12_4_ = auVar233._12_4_;
                auVar82 = rsqrtss(auVar145,auVar233);
                fVar278 = auVar82._0_4_;
                auVar176._0_4_ = fVar278 * 1.5 - fVar278 * fVar278 * fVar253 * 0.5 * fVar278;
                auVar176._4_12_ = auVar82._4_12_;
                local_4b8 = fVar226;
                fStack_4b4 = fVar163;
                fStack_4b0 = fVar237;
                fStack_4ac = fVar238;
                if (fVar253 < 0.0) {
                  local_3d8._4_4_ = fVar250;
                  local_3d8._0_4_ = fVar249;
                  fStack_3d0 = fVar258;
                  fStack_3cc = fVar270;
                  local_518._4_4_ = fVar257;
                  local_518._0_4_ = fVar256;
                  fStack_510 = fVar152 * fStack_3c0;
                  fStack_50c = fVar257;
                  local_4c8 = fVar307;
                  fStack_4c4 = fVar272;
                  fStack_4c0 = fVar152 * fVar294;
                  fStack_4bc = fVar272;
                  _local_418 = auVar176;
                  local_408 = fVar297;
                  fStack_404 = fVar315;
                  fStack_400 = fVar308;
                  fStack_3fc = fVar313;
                  local_3f8 = fVar291;
                  fStack_3f4 = fVar293;
                  fStack_3f0 = fVar295;
                  fStack_3ec = fVar271;
                  _local_3e8 = auVar221;
                  fVar253 = sqrtf(fVar253);
                  pRVar64 = extraout_RAX;
                  auVar176 = _local_418;
                  auVar221 = _local_3e8;
                  fVar249 = (float)local_3d8._0_4_;
                  fVar250 = (float)local_3d8._4_4_;
                  fVar258 = fStack_3d0;
                  fVar270 = fStack_3cc;
                  fVar307 = local_4c8;
                  fVar272 = fStack_4c4;
                  fVar271 = fStack_3ec;
                  fVar297 = local_408;
                  fVar256 = (float)local_518._0_4_;
                  fVar257 = (float)local_518._4_4_;
                }
                else {
                  fVar253 = SQRT(fVar253);
                }
                fVar253 = fVar253 - fVar271;
                fVar163 = local_388 * auVar176._0_4_ - fVar270;
                fVar256 = fVar256 * auVar176._0_4_;
                auVar235._4_4_ = fStack_394;
                auVar235._0_4_ = local_398;
                auVar177._0_4_ = local_398 * fVar256 - fVar307 * fVar163;
                auVar191._8_4_ = -fStack_384;
                auVar191._0_8_ = CONCAT44(fStack_384,fVar163) ^ 0x8000000000000000;
                auVar191._12_4_ = fVar257;
                auVar190._8_8_ = auVar191._8_8_;
                auVar190._0_8_ = CONCAT44(fVar256,fVar163) ^ 0x80000000;
                auVar177._4_4_ = auVar177._0_4_;
                auVar177._8_4_ = auVar177._0_4_;
                auVar177._12_4_ = auVar177._0_4_;
                auVar82 = divps(auVar190,auVar177);
                auVar235._8_4_ = fStack_394;
                auVar235._12_4_ = -fVar272;
                auVar234._8_8_ = auVar235._8_8_;
                auVar234._0_8_ = CONCAT44(fVar307,local_398) ^ 0x8000000000000000;
                auVar155 = divps(auVar234,auVar177);
                fVar226 = local_4b8 - (fVar253 * auVar155._0_4_ + fVar297 * auVar82._0_4_);
                fVar163 = fStack_4b4 - (fVar253 * auVar155._4_4_ + fVar297 * auVar82._4_4_);
                fVar237 = fStack_4b0 - (fVar253 * auVar155._8_4_ + fVar297 * auVar82._8_4_);
                fVar238 = fStack_4ac - (fVar253 * auVar155._12_4_ + fVar297 * auVar82._12_4_);
                if ((ABS(fVar297) < fVar280) &&
                   (ABS(fVar253) < local_428 * 1.9073486e-06 + local_3a8 + fVar280)) {
                  fVar226 = local_2e8._0_4_ + fVar226;
                  if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar226) &&
                     (((fVar125 = (ray->super_RayK<1>).tfar, fVar226 <= fVar125 && (0.0 <= fVar163))
                      && (fVar163 <= 1.0)))) {
                    auVar82 = rsqrtss(auVar221,auVar221);
                    fVar151 = auVar82._0_4_;
                    pGVar21 = (context->scene->geometries).items[(long)pRVar67].ptr;
                    uVar78 = (ray->super_RayK<1>).mask;
                    pRVar64 = (RayHit *)(ulong)uVar78;
                    pRVar66 = pRVar67;
                    if ((pGVar21->mask & uVar78) != 0) {
                      fVar236 = fVar151 * 1.5 + fVar151 * fVar151 * auVar221._0_4_ * -0.5 * fVar151;
                      fVar237 = (float)local_3c8._0_4_ * fVar236;
                      fVar271 = (float)local_3c8._4_4_ * fVar236;
                      fVar236 = fStack_3c0 * fVar236;
                      fVar151 = fVar270 * fVar237 + fVar249;
                      fVar152 = fVar270 * fVar271 + fVar250;
                      fVar153 = fVar270 * fVar236 + fVar258;
                      fVar238 = fVar271 * fVar249 - fVar250 * fVar237;
                      fVar250 = fVar236 * fVar250 - fVar258 * fVar271;
                      fVar237 = fVar237 * fVar258 - fVar249 * fVar236;
                      fVar236 = fVar152 * fVar250 - fVar237 * fVar151;
                      fVar152 = fVar153 * fVar237 - fVar238 * fVar152;
                      fVar151 = fVar151 * fVar238 - fVar250 * fVar153;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar21->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        (ray->super_RayK<1>).tfar = fVar226;
                        *(ulong *)&(ray->Ng).field_0 = CONCAT44(fVar151,fVar152);
                        (ray->Ng).field_0.field_0.z = fVar236;
                        ray->u = fVar163;
                        ray->v = 0.0;
                        ray->primID = uVar76;
                        ray->geomID = uVar74;
                        ray->instID[0] = context->user->instID[0];
                        uVar78 = context->user->instPrimID[0];
                        ray->instPrimID[0] = uVar78;
                        pRVar64 = (RayHit *)(ulong)uVar78;
                      }
                      else {
                        local_498 = CONCAT44(fVar151,fVar152);
                        fStack_490 = fVar236;
                        fStack_48c = fVar163;
                        local_488 = 0;
                        local_484 = uVar76;
                        local_480 = uVar74;
                        local_47c = context->user->instID[0];
                        pRVar66 = (RTCIntersectArguments *)(ulong)local_47c;
                        local_478 = context->user->instPrimID[0];
                        (ray->super_RayK<1>).tfar = fVar226;
                        local_378._0_4_ = 0xffffffff;
                        local_558.geometryUserPtr = pGVar21->userPtr;
                        local_558.valid = (int *)local_378;
                        local_558.context = context->user;
                        local_558.hit = (RTCHitN *)&local_498;
                        local_558.N = 1;
                        local_558.ray = (RTCRayN *)ray;
                        if (pGVar21->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00ad9128:
                          pRVar66 = context->args;
                          if ((pRVar66->filter != (RTCFilterFunctionN)0x0) &&
                             (((pRVar66->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar21->field_8).field_0x2 & 0x40) != 0)))) {
                            (*pRVar66->filter)(&local_558);
                            if ((((RayK<1> *)local_558.valid)->org).field_0.m128[0] == 0.0)
                            goto LAB_00ad91bd;
                          }
                          (((Vec3f *)((long)local_558.ray + 0x30))->field_0).field_0.x =
                               *(float *)local_558.hit;
                          (((Vec3f *)((long)local_558.ray + 0x30))->field_0).field_0.y =
                               *(float *)(local_558.hit + 4);
                          (((Vec3f *)((long)local_558.ray + 0x30))->field_0).field_0.z =
                               *(float *)(local_558.hit + 8);
                          *(float *)((long)local_558.ray + 0x3c) = *(float *)(local_558.hit + 0xc);
                          *(float *)((long)local_558.ray + 0x40) = *(float *)(local_558.hit + 0x10);
                          *(float *)((long)local_558.ray + 0x44) = *(float *)(local_558.hit + 0x14);
                          *(float *)((long)local_558.ray + 0x48) = *(float *)(local_558.hit + 0x18);
                          *(float *)((long)local_558.ray + 0x4c) = *(float *)(local_558.hit + 0x1c);
                          pRVar66 = (RTCIntersectArguments *)
                                    (ulong)(uint)*(float *)(local_558.hit + 0x20);
                          *(float *)((long)local_558.ray + 0x50) = *(float *)(local_558.hit + 0x20);
                          pRVar64 = (RayHit *)local_558.ray;
                        }
                        else {
                          (*pGVar21->intersectionFilterN)(&local_558);
                          if ((((RayK<1> *)local_558.valid)->org).field_0.m128[0] != 0.0)
                          goto LAB_00ad9128;
LAB_00ad91bd:
                          (ray->super_RayK<1>).tfar = fVar125;
                          pRVar64 = (RayHit *)local_558.valid;
                        }
                      }
                    }
                  }
                  break;
                }
                lVar72 = lVar72 + -1;
              } while (lVar72 != 0);
              fVar125 = (ray->super_RayK<1>).tfar;
              local_2d8._0_4_ = -(uint)(local_448 <= fVar125) & local_2d8._0_4_;
              local_2d8._4_4_ = -(uint)(fStack_444 <= fVar125) & local_2d8._4_4_;
              local_2d8._8_4_ = -(uint)(fStack_440 <= fVar125) & local_2d8._8_4_;
              local_2d8._12_4_ = -(uint)(fStack_43c <= fVar125) & local_2d8._12_4_;
              uVar65 = (undefined4)((ulong)pRVar64 >> 0x20);
              iVar60 = movmskps((int)pRVar64,local_2d8);
            } while (iVar60 != 0);
            fVar151 = (float)local_278._0_4_;
            fVar152 = (float)local_278._4_4_;
            fVar153 = fStack_270;
            fVar163 = fStack_26c;
          }
          uVar61 = SUB84(pRVar66,0);
          local_4f8._0_4_ = -(uint)((float)local_4f8._0_4_ + local_4d8 <= fVar125) & local_318._0_4_
          ;
          local_4f8._4_4_ =
               -(uint)((float)local_4f8._4_4_ + fStack_4d4 <= fVar125) & local_318._4_4_;
          fStack_4f0 = (float)(-(uint)(fStack_4f0 + fStack_4d0 <= fVar125) & (uint)fStack_310);
          fStack_4ec = (float)(-(uint)(fStack_4ec + fStack_4cc <= fVar125) & (uint)fStack_30c);
          auVar147._0_4_ =
               -(uint)((int)local_328 <
                      ((int)((-(uint)(0.3 <= ABS((float)local_588._0_4_ * fVar81 +
                                                 fVar165 * fVar123 + auVar189._0_4_ * fVar124)) &
                             local_468._0_4_) << 0x1f) >> 0x1f) + 4);
          auVar147._4_4_ =
               -(uint)((int)fStack_324 <
                      ((int)((-(uint)(0.3 <= ABS((float)local_588._4_4_ * fVar81 +
                                                 fVar184 * fVar123 + auVar189._4_4_ * fVar124)) &
                             local_468._4_4_) << 0x1f) >> 0x1f) + 4);
          auVar147._8_4_ =
               -(uint)((int)fStack_320 <
                      ((int)((-(uint)(0.3 <= ABS(fStack_580 * fVar81 +
                                                 fVar185 * fVar123 + auVar189._8_4_ * fVar124)) &
                             (uint)fStack_460) << 0x1f) >> 0x1f) + 4);
          auVar147._12_4_ =
               -(uint)((int)fStack_31c <
                      ((int)((-(uint)(0.3 <= ABS(fStack_57c * fVar81 +
                                                 fVar186 * fVar123 + auVar189._12_4_ * fVar124)) &
                             (uint)fStack_45c) << 0x1f) >> 0x1f) + 4);
          local_378 = ~auVar147 & _local_4f8;
          iVar60 = movmskps(0,local_378);
          if (iVar60 != 0) {
            local_448 = local_4d8 + fVar151;
            fStack_444 = fStack_4d4 + fVar152;
            fStack_440 = fStack_4d0 + fVar153;
            fStack_43c = fStack_4cc + fVar163;
            local_438._4_4_ = fVar152;
            local_438._0_4_ = fVar151;
            fStack_430 = fVar153;
            fStack_42c = fVar163;
            do {
              uVar78 = local_378._0_4_;
              uVar75 = local_378._4_4_;
              uVar77 = local_378._8_4_;
              uVar79 = local_378._12_4_;
              auVar116._0_4_ = uVar78 & (uint)fVar151;
              auVar116._4_4_ = uVar75 & (uint)fVar152;
              auVar116._8_4_ = uVar77 & (uint)fVar153;
              auVar116._12_4_ = uVar79 & (uint)fVar163;
              auVar162._0_8_ = CONCAT44(~uVar75,~uVar78) & 0x7f8000007f800000;
              auVar162._8_4_ = ~uVar77 & 0x7f800000;
              auVar162._12_4_ = ~uVar79 & 0x7f800000;
              auVar162 = auVar162 | auVar116;
              auVar179._4_4_ = auVar162._0_4_;
              auVar179._0_4_ = auVar162._4_4_;
              auVar179._8_4_ = auVar162._12_4_;
              auVar179._12_4_ = auVar162._8_4_;
              auVar82 = minps(auVar179,auVar162);
              auVar117._0_8_ = auVar82._8_8_;
              auVar117._8_4_ = auVar82._0_4_;
              auVar117._12_4_ = auVar82._4_4_;
              auVar82 = minps(auVar117,auVar82);
              auVar118._0_8_ =
                   CONCAT44(-(uint)(auVar82._4_4_ == auVar162._4_4_) & uVar75,
                            -(uint)(auVar82._0_4_ == auVar162._0_4_) & uVar78);
              auVar118._8_4_ = -(uint)(auVar82._8_4_ == auVar162._8_4_) & uVar77;
              auVar118._12_4_ = -(uint)(auVar82._12_4_ == auVar162._12_4_) & uVar79;
              iVar60 = movmskps(iVar60,auVar118);
              auVar148 = local_378;
              if (iVar60 != 0) {
                auVar148._8_4_ = auVar118._8_4_;
                auVar148._0_8_ = auVar118._0_8_;
                auVar148._12_4_ = auVar118._12_4_;
              }
              uVar61 = movmskps(iVar60,auVar148);
              pRVar64 = (RayHit *)0x0;
              if (CONCAT44(uVar65,uVar61) != 0) {
                for (; (CONCAT44(uVar65,uVar61) >> (long)pRVar64 & 1) == 0;
                    pRVar64 = (RayHit *)((long)(pRVar64->super_RayK<1>).org.field_0.m128 + 1)) {
                }
              }
              *(undefined4 *)(local_378 + (long)pRVar64 * 4) = 0;
              fVar81 = (ray->super_RayK<1>).dir.field_0.m128[0];
              fVar123 = (ray->super_RayK<1>).dir.field_0.m128[1];
              fVar124 = (ray->super_RayK<1>).dir.field_0.m128[2];
              fVar125 = (ray->super_RayK<1>).dir.field_0.m128[3];
              auVar31._4_4_ = fStack_4a4;
              auVar31._0_4_ = local_4a8;
              auVar31._8_4_ = fStack_4a0;
              auVar31._12_4_ = fStack_49c;
              auVar155 = minps(auVar248,auVar31);
              auVar263 = maxps(auVar248,auVar31);
              auVar33._4_4_ = fStack_334;
              auVar33._0_4_ = local_338;
              auVar33._8_4_ = fStack_330;
              auVar33._12_4_ = fStack_32c;
              auVar82 = minps(auVar33,_local_568);
              auVar155 = minps(auVar155,auVar82);
              auVar82 = maxps(auVar33,_local_568);
              auVar82 = maxps(auVar263,auVar82);
              auVar180._0_8_ = auVar155._0_8_ & 0x7fffffff7fffffff;
              auVar180._8_4_ = auVar155._8_4_ & 0x7fffffff;
              auVar180._12_4_ = auVar155._12_4_ & 0x7fffffff;
              local_428 = auVar82._12_4_;
              auVar119._0_8_ = auVar82._0_8_ & 0x7fffffff7fffffff;
              auVar119._8_4_ = auVar82._8_4_ & 0x7fffffff;
              auVar119._12_4_ = ABS(local_428);
              auVar82 = maxps(auVar180,auVar119);
              fVar151 = auVar82._4_4_;
              if (auVar82._4_4_ <= auVar82._0_4_) {
                fVar151 = auVar82._0_4_;
              }
              auVar181._8_8_ = auVar82._8_8_;
              auVar181._0_8_ = auVar82._8_8_;
              if (auVar82._8_4_ <= fVar151) {
                auVar181._0_4_ = fVar151;
              }
              fVar153 = auVar181._0_4_ * 1.9073486e-06;
              local_3d8._0_4_ =
                   SQRT(fVar124 * fVar124 + fVar123 * fVar123 + fVar81 * fVar81) * 1.9073486e-06;
              fStack_424 = local_428;
              fStack_420 = local_428;
              fStack_41c = local_428;
              fVar151 = local_118[(long)pRVar64];
              fVar152 = *(float *)(local_268 + (long)pRVar64 * 4);
              fVar163 = 0.0;
              fVar165 = 0.0;
              lVar72 = 5;
              do {
                fVar250 = 1.0 - fVar151;
                fVar236 = local_4a8 * fVar250 + local_338 * fVar151;
                fVar237 = fStack_4a4 * fVar250 + fStack_334 * fVar151;
                fVar238 = fStack_4a0 * fVar250 + fStack_330 * fVar151;
                fVar249 = fStack_49c * fVar250 + fStack_32c * fVar151;
                fVar184 = (auVar248._0_4_ * fVar250 + local_4a8 * fVar151) * fVar250 +
                          fVar151 * fVar236;
                fVar185 = (auVar248._4_4_ * fVar250 + fStack_4a4 * fVar151) * fVar250 +
                          fVar151 * fVar237;
                fVar186 = (auVar248._8_4_ * fVar250 + fStack_4a0 * fVar151) * fVar250 +
                          fVar151 * fVar238;
                fVar226 = (auVar248._12_4_ * fVar250 + fStack_49c * fVar151) * fVar250 +
                          fVar151 * fVar249;
                fVar236 = fVar236 * fVar250 +
                          (local_338 * fVar250 + (float)local_568._0_4_ * fVar151) * fVar151;
                fVar237 = fVar237 * fVar250 +
                          (fStack_334 * fVar250 + (float)local_568._4_4_ * fVar151) * fVar151;
                fVar238 = fVar238 * fVar250 +
                          (fStack_330 * fVar250 + fStack_560 * fVar151) * fVar151;
                fVar249 = fVar249 * fVar250 +
                          (fStack_32c * fVar250 + fStack_55c * fVar151) * fVar151;
                local_388 = fVar250 * fVar184 + fVar151 * fVar236;
                fStack_384 = fVar250 * fVar185 + fVar151 * fVar237;
                fStack_380 = fVar250 * fVar186 + fVar151 * fVar238;
                fStack_37c = fVar250 * fVar226 + fVar151 * fVar249;
                fVar236 = (fVar236 - fVar184) * 3.0;
                fVar237 = (fVar237 - fVar185) * 3.0;
                fVar238 = (fVar238 - fVar186) * 3.0;
                fVar226 = (fVar249 - fVar226) * 3.0;
                fVar249 = fVar250 * 6.0;
                fVar185 = (fVar151 - (fVar250 + fVar250)) * 6.0;
                fVar186 = (fVar250 - (fVar151 + fVar151)) * 6.0;
                fVar184 = fVar151 * 6.0;
                fVar250 = fVar249 * auVar248._0_4_ +
                          fVar185 * local_4a8 +
                          fVar186 * local_338 + fVar184 * (float)local_568._0_4_;
                fVar258 = fVar249 * auVar248._4_4_ +
                          fVar185 * fStack_4a4 +
                          fVar186 * fStack_334 + fVar184 * (float)local_568._4_4_;
                fVar185 = fVar249 * auVar248._8_4_ +
                          fVar185 * fStack_4a0 + fVar186 * fStack_330 + fVar184 * fStack_560;
                local_3f8 = (fVar152 * fVar81 + 0.0) - local_388;
                fStack_3f4 = (fVar152 * fVar123 + 0.0) - fStack_384;
                fStack_3f0 = (fVar152 * fVar124 + 0.0) - fStack_380;
                fStack_3ec = (fVar152 * fVar125 + 0.0) - fStack_37c;
                fVar184 = fStack_3f4 * fStack_3f4;
                fStack_3e0 = fStack_3f0 * fStack_3f0;
                fStack_3dc = fStack_3ec * fStack_3ec;
                local_3e8._0_4_ = fVar184 + local_3f8 * local_3f8 + fStack_3e0;
                local_3e8._4_4_ = fVar184 + fVar184 + fStack_3dc;
                fStack_3e0 = fVar184 + fStack_3e0 + fStack_3e0;
                fStack_3dc = fVar184 + fStack_3dc + fStack_3dc;
                fStack_5a4 = auVar181._4_4_;
                fStack_5a0 = auVar181._8_4_;
                fStack_59c = auVar181._12_4_;
                local_3c8._0_4_ = fVar153;
                if (fVar153 <= (float)local_3d8._0_4_ * fVar152) {
                  local_3c8._0_4_ = (float)local_3d8._0_4_ * fVar152;
                }
                fVar249 = fVar237 * fVar237 + fVar236 * fVar236 + fVar238 * fVar238;
                auVar155 = ZEXT416((uint)fVar249);
                auVar82 = rsqrtss(ZEXT416((uint)fVar249),auVar155);
                fVar184 = auVar82._0_4_;
                fVar271 = fVar184 * 1.5 - fVar184 * fVar184 * fVar249 * 0.5 * fVar184;
                fVar256 = fVar236 * fVar271;
                fVar257 = fVar237 * fVar271;
                fVar272 = fVar238 * fVar271;
                local_3b8._4_4_ = fVar226 * fVar271;
                fVar278 = fVar238 * fVar185 + fVar237 * fVar258 + fVar236 * fVar250;
                auVar82 = rcpss(auVar155,auVar155);
                fVar186 = (2.0 - fVar249 * auVar82._0_4_) * auVar82._0_4_;
                fVar270 = fStack_3f4 * fVar257;
                fVar307 = fStack_3f0 * fVar272;
                fVar253 = fStack_3ec * (float)local_3b8._4_4_;
                fVar184 = fVar270 + local_3f8 * fVar256 + fVar307;
                fVar279 = fVar270 + fVar270 + fVar253;
                fVar307 = fVar270 + fVar307 + fVar307;
                fVar253 = fVar270 + fVar253 + fVar253;
                local_3c8._4_4_ = fStack_5a4;
                fStack_3c0 = fStack_5a0;
                fStack_3bc = fStack_59c;
                local_398 = (SQRT((float)local_3e8._0_4_) + 1.0) * (fVar153 / SQRT(fVar249)) +
                            SQRT((float)local_3e8._0_4_) * fVar153 + (float)local_3c8._0_4_;
                fVar270 = fVar125 * (float)local_3b8._4_4_;
                fStack_3b0 = fVar272 * -fVar238;
                local_3b8._4_4_ = (float)local_3b8._4_4_ * -fVar226;
                local_3b8._0_4_ =
                     fStack_3b0 + fVar257 * -fVar237 + fVar256 * -fVar236 +
                     fVar186 * (fVar249 * fVar185 - fVar278 * fVar238) * fVar271 * fStack_3f0 +
                     fVar186 * (fVar249 * fVar258 - fVar278 * fVar237) * fVar271 * fStack_3f4 +
                     fVar186 * (fVar249 * fVar250 - fVar278 * fVar236) * fVar271 * local_3f8;
                fVar249 = fVar124 * fVar272 + fVar123 * fVar257 + fVar81 * fVar256;
                fVar250 = (float)local_3e8._0_4_ - fVar184 * fVar184;
                auVar290._0_8_ = CONCAT44((float)local_3e8._4_4_ - fVar279 * fVar279,fVar250);
                auVar290._8_4_ = fStack_3e0 - fVar307 * fVar307;
                auVar290._12_4_ = fStack_3dc - fVar253 * fVar253;
                fStack_3a0 = -fVar238 * fStack_3f0;
                fStack_3a4 = -fVar226 * fStack_3ec;
                fStack_3ac = (float)local_3b8._4_4_;
                local_3a8 = (fStack_3a0 + -fVar237 * fStack_3f4 + -fVar236 * local_3f8) -
                            fVar184 * (float)local_3b8._0_4_;
                fStack_39c = fStack_3a4;
                fVar186 = fVar125 * fStack_3ec;
                fVar185 = (fVar124 * fStack_3f0 + fVar123 * fStack_3f4 + fVar81 * local_3f8) -
                          fVar184 * fVar249;
                auVar149._8_4_ = auVar290._8_4_;
                auVar149._0_8_ = auVar290._0_8_;
                auVar149._12_4_ = auVar290._12_4_;
                auVar82 = rsqrtss(auVar149,auVar290);
                fVar258 = auVar82._0_4_;
                auVar182._0_4_ = fVar258 * 1.5 - fVar258 * fVar258 * fVar250 * 0.5 * fVar258;
                auVar182._4_12_ = auVar82._4_12_;
                local_4b8 = fVar152;
                fStack_4b4 = fVar151;
                fStack_4b0 = fVar163;
                fStack_4ac = fVar165;
                if (fVar250 < 0.0) {
                  local_518._4_4_ = fVar186;
                  local_518._0_4_ = fVar185;
                  fStack_510 = fVar124 * fStack_3f0;
                  fStack_50c = fVar186;
                  local_4c8 = fVar249;
                  fStack_4c4 = fVar270;
                  fStack_4c0 = fVar124 * fVar272;
                  fStack_4bc = fVar270;
                  _local_418 = auVar182;
                  local_408 = fVar184;
                  fStack_404 = fVar279;
                  fStack_400 = fVar307;
                  fStack_3fc = fVar253;
                  fVar250 = sqrtf(fVar250);
                  pRVar64 = extraout_RAX_00;
                  auVar182 = _local_418;
                  fVar184 = local_408;
                  fVar185 = (float)local_518._0_4_;
                  fVar186 = (float)local_518._4_4_;
                  fVar249 = local_4c8;
                  fVar270 = fStack_4c4;
                }
                else {
                  fVar250 = SQRT(fVar250);
                }
                auVar248._4_4_ = fVar196;
                auVar248._0_4_ = fVar195;
                auVar248._8_4_ = fVar197;
                auVar248._12_4_ = fVar224;
                fVar250 = fVar250 - fStack_37c;
                fVar151 = local_3a8 * auVar182._0_4_ - fVar226;
                fVar185 = fVar185 * auVar182._0_4_;
                auVar223._0_8_ = local_3b8;
                auVar183._0_4_ = local_3b8._0_4_ * fVar185 - fVar249 * fVar151;
                auVar193._8_4_ = -fStack_3a4;
                auVar193._0_8_ = CONCAT44(fStack_3a4,fVar151) ^ 0x8000000000000000;
                auVar193._12_4_ = fVar186;
                auVar192._8_8_ = auVar193._8_8_;
                auVar192._0_8_ = CONCAT44(fVar185,fVar151) ^ 0x80000000;
                auVar183._4_4_ = auVar183._0_4_;
                auVar183._8_4_ = auVar183._0_4_;
                auVar183._12_4_ = auVar183._0_4_;
                auVar82 = divps(auVar192,auVar183);
                auVar223._8_4_ = local_3b8._4_4_;
                auVar223._12_4_ = -fVar270;
                auVar222._8_8_ = auVar223._8_8_;
                auVar222._0_8_ = CONCAT44(fVar249,local_3b8._0_4_) ^ 0x8000000000000000;
                auVar155 = divps(auVar222,auVar183);
                fVar152 = local_4b8 - (fVar250 * auVar155._0_4_ + fVar184 * auVar82._0_4_);
                fVar151 = fStack_4b4 - (fVar250 * auVar155._4_4_ + fVar184 * auVar82._4_4_);
                fVar163 = fStack_4b0 - (fVar250 * auVar155._8_4_ + fVar184 * auVar82._8_4_);
                fVar165 = fStack_4ac - (fVar250 * auVar155._12_4_ + fVar184 * auVar82._12_4_);
                if ((ABS(fVar184) < local_398) &&
                   (ABS(fVar250) < local_428 * 1.9073486e-06 + (float)local_3c8._0_4_ + local_398))
                {
                  fVar152 = local_2e8._0_4_ + fVar152;
                  if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar152) &&
                     (((fVar81 = (ray->super_RayK<1>).tfar, fVar152 <= fVar81 && (0.0 <= fVar151))
                      && (fVar151 <= 1.0)))) {
                    auVar82 = rsqrtss(_local_3e8,_local_3e8);
                    fVar123 = auVar82._0_4_;
                    pGVar21 = (context->scene->geometries).items[(long)pRVar67].ptr;
                    uVar78 = (ray->super_RayK<1>).mask;
                    pRVar64 = (RayHit *)(ulong)uVar78;
                    pRVar66 = pRVar67;
                    if ((pGVar21->mask & uVar78) != 0) {
                      fVar153 = fVar123 * 1.5 + fVar123 * fVar123 * local_3e8._0_4_ * -0.5 * fVar123
                      ;
                      fVar163 = local_3f8 * fVar153;
                      fVar184 = fStack_3f4 * fVar153;
                      fVar153 = fStack_3f0 * fVar153;
                      fVar123 = fVar226 * fVar163 + fVar236;
                      fVar124 = fVar226 * fVar184 + fVar237;
                      fVar125 = fVar226 * fVar153 + fVar238;
                      fVar165 = fVar184 * fVar236 - fVar237 * fVar163;
                      fVar184 = fVar153 * fVar237 - fVar238 * fVar184;
                      fVar163 = fVar163 * fVar238 - fVar236 * fVar153;
                      fVar153 = fVar124 * fVar184 - fVar163 * fVar123;
                      fVar124 = fVar125 * fVar163 - fVar165 * fVar124;
                      fVar123 = fVar123 * fVar165 - fVar184 * fVar125;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar21->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        (ray->super_RayK<1>).tfar = fVar152;
                        *(ulong *)&(ray->Ng).field_0 = CONCAT44(fVar123,fVar124);
                        (ray->Ng).field_0.field_0.z = fVar153;
                        ray->u = fVar151;
                        ray->v = 0.0;
                        ray->primID = uVar76;
                        ray->geomID = uVar74;
                        ray->instID[0] = context->user->instID[0];
                        uVar78 = context->user->instPrimID[0];
                        ray->instPrimID[0] = uVar78;
                        pRVar64 = (RayHit *)(ulong)uVar78;
                      }
                      else {
                        local_498 = CONCAT44(fVar123,fVar124);
                        fStack_490 = fVar153;
                        fStack_48c = fVar151;
                        local_488 = 0;
                        local_484 = uVar76;
                        local_480 = uVar74;
                        local_47c = context->user->instID[0];
                        pRVar66 = (RTCIntersectArguments *)(ulong)local_47c;
                        local_478 = context->user->instPrimID[0];
                        (ray->super_RayK<1>).tfar = fVar152;
                        local_4fc = 0xffffffff;
                        local_558.geometryUserPtr = pGVar21->userPtr;
                        local_558.valid = &local_4fc;
                        local_558.context = context->user;
                        local_558.hit = (RTCHitN *)&local_498;
                        local_558.N = 1;
                        local_558.ray = (RTCRayN *)ray;
                        if (pGVar21->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00ad9bea:
                          pRVar66 = context->args;
                          if ((pRVar66->filter != (RTCFilterFunctionN)0x0) &&
                             (((pRVar66->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar21->field_8).field_0x2 & 0x40) != 0)))) {
                            (*pRVar66->filter)(&local_558);
                            if ((((RayK<1> *)local_558.valid)->org).field_0.m128[0] == 0.0)
                            goto LAB_00ad9c84;
                          }
                          (((Vec3f *)((long)local_558.ray + 0x30))->field_0).field_0.x =
                               *(float *)local_558.hit;
                          (((Vec3f *)((long)local_558.ray + 0x30))->field_0).field_0.y =
                               *(float *)(local_558.hit + 4);
                          (((Vec3f *)((long)local_558.ray + 0x30))->field_0).field_0.z =
                               *(float *)(local_558.hit + 8);
                          *(float *)((long)local_558.ray + 0x3c) = *(float *)(local_558.hit + 0xc);
                          *(float *)((long)local_558.ray + 0x40) = *(float *)(local_558.hit + 0x10);
                          *(float *)((long)local_558.ray + 0x44) = *(float *)(local_558.hit + 0x14);
                          *(float *)((long)local_558.ray + 0x48) = *(float *)(local_558.hit + 0x18);
                          *(float *)((long)local_558.ray + 0x4c) = *(float *)(local_558.hit + 0x1c);
                          pRVar66 = (RTCIntersectArguments *)
                                    (ulong)(uint)*(float *)(local_558.hit + 0x20);
                          *(float *)((long)local_558.ray + 0x50) = *(float *)(local_558.hit + 0x20);
                          pRVar64 = (RayHit *)local_558.ray;
                        }
                        else {
                          (*pGVar21->intersectionFilterN)(&local_558);
                          if ((((RayK<1> *)local_558.valid)->org).field_0.m128[0] != 0.0)
                          goto LAB_00ad9bea;
LAB_00ad9c84:
                          (ray->super_RayK<1>).tfar = fVar81;
                          pRVar64 = (RayHit *)local_558.valid;
                        }
                      }
                    }
                  }
                  break;
                }
                lVar72 = lVar72 + -1;
              } while (lVar72 != 0);
              uVar61 = SUB84(pRVar66,0);
              fVar125 = (ray->super_RayK<1>).tfar;
              local_378._0_4_ = -(uint)(local_448 <= fVar125) & local_378._0_4_;
              local_378._4_4_ = -(uint)(fStack_444 <= fVar125) & local_378._4_4_;
              local_378._8_4_ = -(uint)(fStack_440 <= fVar125) & local_378._8_4_;
              local_378._12_4_ = -(uint)(fStack_43c <= fVar125) & local_378._12_4_;
              uVar65 = (undefined4)((ulong)pRVar64 >> 0x20);
              iVar60 = movmskps((int)pRVar64,local_378);
              fVar151 = (float)local_438._0_4_;
              fVar152 = (float)local_438._4_4_;
              fVar153 = fStack_430;
              fVar163 = fStack_42c;
            } while (iVar60 != 0);
            iVar60 = 0;
            fVar151 = (float)local_278._0_4_;
            fVar152 = (float)local_278._4_4_;
            fVar153 = fStack_270;
            fVar163 = fStack_26c;
          }
          auVar194._0_4_ =
               local_4e8._0_4_ & local_308._0_4_ &
               -(uint)(local_4d8 + (float)local_138._0_4_ <= fVar125);
          auVar194._4_4_ =
               local_4e8._4_4_ & local_308._4_4_ &
               -(uint)(fStack_4d4 + (float)local_138._4_4_ <= fVar125);
          auVar194._8_4_ =
               (uint)fStack_4e0 & (uint)fStack_300 & -(uint)(fStack_4d0 + fStack_130 <= fVar125);
          auVar194._12_4_ =
               (uint)fStack_4dc & (uint)fStack_2fc & -(uint)(fStack_4cc + fStack_12c <= fVar125);
          auVar120._0_4_ =
               auVar147._0_4_ & local_4f8._0_4_ & -(uint)(local_4d8 + fVar151 <= fVar125);
          auVar120._4_4_ =
               auVar147._4_4_ & local_4f8._4_4_ & -(uint)(fStack_4d4 + fVar152 <= fVar125);
          auVar120._8_4_ =
               auVar147._8_4_ & (uint)fStack_4f0 & -(uint)(fStack_4d0 + fVar153 <= fVar125);
          auVar120._12_4_ =
               auVar147._12_4_ & (uint)fStack_4ec & -(uint)(fStack_4cc + fVar163 <= fVar125);
          iVar60 = movmskps(iVar60,auVar120 | auVar194);
          if (iVar60 != 0) {
            *(undefined1 (*) [16])(auStack_f8 + uVar69 * 0x30) = auVar120 | auVar194;
            auStack_e8[uVar69 * 0xc] =
                 ~auVar194._0_4_ & (uint)fVar151 | local_138._0_4_ & auVar194._0_4_;
            auStack_e8[uVar69 * 0xc + 1] =
                 ~auVar194._4_4_ & (uint)fVar152 | local_138._4_4_ & auVar194._4_4_;
            auStack_e8[uVar69 * 0xc + 2] =
                 ~auVar194._8_4_ & (uint)fVar153 | (uint)fStack_130 & auVar194._8_4_;
            auStack_e8[uVar69 * 0xc + 3] =
                 ~auVar194._12_4_ & (uint)fVar163 | (uint)fStack_12c & auVar194._12_4_;
            (&uStack_d8)[uVar69 * 6] = CONCAT44(fStack_1d4,local_1d8);
            aiStack_d0[uVar69 * 0xc] = (int)fVar164 + 1;
            iVar68 = iVar68 + 1;
          }
        }
      }
    }
    fVar186 = fStack_33c;
    fVar185 = fStack_340;
    fVar184 = fStack_344;
    fVar165 = local_348;
    fVar163 = fStack_34c;
    fVar153 = fStack_350;
    fVar125 = fStack_354;
    fVar152 = local_358;
    fVar124 = fStack_35c;
    fVar123 = fStack_360;
    fVar81 = fStack_364;
    fVar151 = local_368;
    fVar164 = (ray->super_RayK<1>).tfar;
    if (iVar68 == 0) break;
    uVar75 = -iVar68;
    pauVar63 = (undefined1 (*) [16])(auStack_f8 + (ulong)(iVar68 - 1) * 0x30);
    uVar78 = uVar75;
    while( true ) {
      local_558.valid._0_4_ =
           -(uint)(local_4d8 + *(float *)pauVar63[1] <= fVar164) & *(uint *)*pauVar63;
      local_558.valid._4_4_ =
           -(uint)(fStack_4d4 + *(float *)(pauVar63[1] + 4) <= fVar164) & *(uint *)(*pauVar63 + 4);
      local_558.geometryUserPtr._0_4_ =
           -(uint)(fStack_4d0 + *(float *)(pauVar63[1] + 8) <= fVar164) & *(uint *)(*pauVar63 + 8);
      local_558.geometryUserPtr._4_4_ =
           -(uint)(fStack_4cc + *(float *)(pauVar63[1] + 0xc) <= fVar164) &
           *(uint *)(*pauVar63 + 0xc);
      iVar60 = movmskps(uVar78,(undefined1  [16])local_558._0_16_);
      if (iVar60 != 0) break;
      pauVar63 = pauVar63 + -3;
      uVar75 = uVar75 + 1;
      uVar78 = 0;
      if (uVar75 == 0) {
        uVar61 = 0;
        goto LAB_00ad9d4e;
      }
    }
    auVar160._0_4_ = (uint)*(float *)pauVar63[1] & (uint)local_558.valid;
    auVar160._4_4_ = (uint)*(float *)(pauVar63[1] + 4) & local_558.valid._4_4_;
    auVar160._8_4_ = (uint)*(float *)(pauVar63[1] + 8) & (uint)local_558.geometryUserPtr;
    auVar160._12_4_ = (uint)*(float *)(pauVar63[1] + 0xc) & local_558.geometryUserPtr._4_4_;
    auVar178._0_8_ = CONCAT44(~local_558.valid._4_4_,~(uint)local_558.valid) & 0x7f8000007f800000;
    auVar178._8_4_ = ~(uint)local_558.geometryUserPtr & 0x7f800000;
    auVar178._12_4_ = ~local_558.geometryUserPtr._4_4_ & 0x7f800000;
    auVar178 = auVar178 | auVar160;
    auVar161._4_4_ = auVar178._0_4_;
    auVar161._0_4_ = auVar178._4_4_;
    auVar161._8_4_ = auVar178._12_4_;
    auVar161._12_4_ = auVar178._8_4_;
    auVar82 = minps(auVar161,auVar178);
    auVar114._0_8_ = auVar82._8_8_;
    auVar114._8_4_ = auVar82._0_4_;
    auVar114._12_4_ = auVar82._4_4_;
    auVar82 = minps(auVar114,auVar82);
    auVar115._0_8_ =
         CONCAT44(-(uint)(auVar82._4_4_ == auVar178._4_4_) & local_558.valid._4_4_,
                  -(uint)(auVar82._0_4_ == auVar178._0_4_) & (uint)local_558.valid);
    auVar115._8_4_ = -(uint)(auVar82._8_4_ == auVar178._8_4_) & (uint)local_558.geometryUserPtr;
    auVar115._12_4_ = -(uint)(auVar82._12_4_ == auVar178._12_4_) & local_558.geometryUserPtr._4_4_;
    iVar60 = movmskps(iVar60,auVar115);
    auVar146 = (undefined1  [16])local_558._0_16_;
    if (iVar60 != 0) {
      auVar146._8_4_ = auVar115._8_4_;
      auVar146._0_8_ = auVar115._0_8_;
      auVar146._12_4_ = auVar115._12_4_;
    }
    uVar19 = *(undefined8 *)pauVar63[2];
    fVar164 = *(float *)(pauVar63[2] + 8);
    uVar78 = movmskps(iVar60,auVar146);
    pRVar66 = (RTCIntersectArguments *)0x0;
    if (uVar78 != 0) {
      for (; (uVar78 >> (long)pRVar66 & 1) == 0;
          pRVar66 = (RTCIntersectArguments *)((long)&pRVar66->flags + 1)) {
      }
    }
    *(undefined4 *)((long)&local_558.valid + (long)pRVar66 * 4) = 0;
    *pauVar63 = (undefined1  [16])local_558._0_16_;
    iVar60 = movmskps((int)pauVar63,(undefined1  [16])local_558._0_16_);
    lVar72 = CONCAT44((int)((ulong)pauVar63 >> 0x20),iVar60);
    uVar78 = ~uVar75;
    if (iVar60 != 0) {
      uVar78 = -uVar75;
    }
    uVar69 = (ulong)uVar78;
    fVar226 = (float)uVar19;
    fVar236 = (float)((ulong)uVar19 >> 0x20) - fVar226;
    local_498 = CONCAT44(fVar236 * 0.33333334 + fVar226,fVar236 * 0.0 + fVar226);
    fStack_490 = fVar236 * 0.6666667 + fVar226;
    fStack_48c = fVar236 * 1.0 + fVar226;
    local_1d8 = *(float *)((long)&local_498 + (long)pRVar66 * 4);
    fStack_1d4 = *(float *)((long)&local_498 + (long)pRVar66 * 4 + 4);
  } while( true );
LAB_00ad9d4e:
  auVar150._4_4_ = -(uint)(fStack_254 <= fVar164);
  auVar150._0_4_ = -(uint)(local_258 <= fVar164);
  auVar150._8_4_ = -(uint)(fStack_250 <= fVar164);
  auVar150._12_4_ = -(uint)(fStack_24c <= fVar164);
  uVar74 = movmskps(uVar61,auVar150);
  uVar73 = uVar73 - 1 & uVar73 & uVar74;
  if (uVar73 == 0) {
    return;
  }
  goto LAB_00ad7710;
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time());

          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }